

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  float fVar97;
  vint4 bi_2;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined4 uVar104;
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar120;
  float fVar121;
  vint4 bi;
  undefined1 auVar113 [16];
  float fVar122;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar137;
  float fVar138;
  vint4 ai_2;
  undefined1 auVar132 [16];
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 ai;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  vint4 ai_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  vfloat4 a0_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  float fVar194;
  float fVar203;
  float fVar204;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar206;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar218;
  float fVar225;
  float fVar226;
  vfloat4 a0;
  undefined1 auVar219 [16];
  float fVar227;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  vfloat4 a0_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_388 [16];
  RTCFilterFunctionNArguments local_378;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  uint auStack_328 [4];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined8 uStack_148;
  RTCHitN local_128 [16];
  undefined1 local_118 [16];
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar26;
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  
  PVar3 = prim[1];
  uVar31 = (ulong)(byte)PVar3;
  fVar97 = *(float *)(prim + uVar31 * 0x19 + 0x12);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar38 = vsubps_avx(auVar38,*(undefined1 (*) [16])(prim + uVar31 * 0x19 + 6));
  auVar58._0_4_ = fVar97 * auVar38._0_4_;
  auVar58._4_4_ = fVar97 * auVar38._4_4_;
  auVar58._8_4_ = fVar97 * auVar38._8_4_;
  auVar58._12_4_ = fVar97 * auVar38._12_4_;
  auVar45._0_4_ = fVar97 * auVar39._0_4_;
  auVar45._4_4_ = fVar97 * auVar39._4_4_;
  auVar45._8_4_ = fVar97 * auVar39._8_4_;
  auVar45._12_4_ = fVar97 * auVar39._12_4_;
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 * 4 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 * 5 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 * 6 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar31 * 0xb + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar31 + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  uVar37 = (ulong)(uint)((int)(uVar31 * 9) * 2);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 + uVar31 + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  uVar25 = (ulong)(uint)((int)(uVar31 * 5) << 2);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar62._4_4_ = auVar45._0_4_;
  auVar62._0_4_ = auVar45._0_4_;
  auVar62._8_4_ = auVar45._0_4_;
  auVar62._12_4_ = auVar45._0_4_;
  auVar43 = vshufps_avx(auVar45,auVar45,0x55);
  auVar41 = vshufps_avx(auVar45,auVar45,0xaa);
  fVar97 = auVar41._0_4_;
  auVar54._0_4_ = fVar97 * auVar40._0_4_;
  fVar205 = auVar41._4_4_;
  auVar54._4_4_ = fVar205 * auVar40._4_4_;
  fVar194 = auVar41._8_4_;
  auVar54._8_4_ = fVar194 * auVar40._8_4_;
  fVar203 = auVar41._12_4_;
  auVar54._12_4_ = fVar203 * auVar40._12_4_;
  auVar61._0_4_ = auVar49._0_4_ * fVar97;
  auVar61._4_4_ = auVar49._4_4_ * fVar205;
  auVar61._8_4_ = auVar49._8_4_ * fVar194;
  auVar61._12_4_ = auVar49._12_4_ * fVar203;
  auVar46._0_4_ = auVar10._0_4_ * fVar97;
  auVar46._4_4_ = auVar10._4_4_ * fVar205;
  auVar46._8_4_ = auVar10._8_4_ * fVar194;
  auVar46._12_4_ = auVar10._12_4_ * fVar203;
  auVar41 = vfmadd231ps_fma(auVar54,auVar43,auVar39);
  auVar42 = vfmadd231ps_fma(auVar61,auVar43,auVar50);
  auVar43 = vfmadd231ps_fma(auVar46,auVar48,auVar43);
  auVar44 = vfmadd231ps_fma(auVar41,auVar62,auVar38);
  auVar42 = vfmadd231ps_fma(auVar42,auVar62,auVar51);
  auVar45 = vfmadd231ps_fma(auVar43,auVar56,auVar62);
  auVar63._4_4_ = auVar58._0_4_;
  auVar63._0_4_ = auVar58._0_4_;
  auVar63._8_4_ = auVar58._0_4_;
  auVar63._12_4_ = auVar58._0_4_;
  auVar43 = vshufps_avx(auVar58,auVar58,0x55);
  auVar41 = vshufps_avx(auVar58,auVar58,0xaa);
  fVar97 = auVar41._0_4_;
  auVar232._0_4_ = fVar97 * auVar40._0_4_;
  fVar205 = auVar41._4_4_;
  auVar232._4_4_ = fVar205 * auVar40._4_4_;
  fVar194 = auVar41._8_4_;
  auVar232._8_4_ = fVar194 * auVar40._8_4_;
  fVar203 = auVar41._12_4_;
  auVar232._12_4_ = fVar203 * auVar40._12_4_;
  auVar64._0_4_ = auVar49._0_4_ * fVar97;
  auVar64._4_4_ = auVar49._4_4_ * fVar205;
  auVar64._8_4_ = auVar49._8_4_ * fVar194;
  auVar64._12_4_ = auVar49._12_4_ * fVar203;
  auVar57._0_4_ = auVar10._0_4_ * fVar97;
  auVar57._4_4_ = auVar10._4_4_ * fVar205;
  auVar57._8_4_ = auVar10._8_4_ * fVar194;
  auVar57._12_4_ = auVar10._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar232,auVar43,auVar39);
  auVar40 = vfmadd231ps_fma(auVar64,auVar43,auVar50);
  auVar50 = vfmadd231ps_fma(auVar57,auVar43,auVar48);
  auVar49 = vfmadd231ps_fma(auVar39,auVar63,auVar38);
  auVar48 = vfmadd231ps_fma(auVar40,auVar63,auVar51);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar38);
  auVar10 = vfmadd231ps_fma(auVar50,auVar63,auVar56);
  auVar39 = vandps_avx512vl(auVar44,auVar38);
  auVar53._8_4_ = 0x219392ef;
  auVar53._0_8_ = 0x219392ef219392ef;
  auVar53._12_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar39,auVar53,1);
  bVar34 = (bool)((byte)uVar37 & 1);
  auVar41._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar44._0_4_;
  bVar34 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar44._4_4_;
  bVar34 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar44._8_4_;
  bVar34 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar44._12_4_;
  auVar39 = vandps_avx512vl(auVar42,auVar38);
  uVar37 = vcmpps_avx512vl(auVar39,auVar53,1);
  bVar34 = (bool)((byte)uVar37 & 1);
  auVar44._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar42._0_4_;
  bVar34 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar42._4_4_;
  bVar34 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar42._8_4_;
  bVar34 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar42._12_4_;
  auVar38 = vandps_avx512vl(auVar45,auVar38);
  uVar37 = vcmpps_avx512vl(auVar38,auVar53,1);
  bVar34 = (bool)((byte)uVar37 & 1);
  auVar42._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._0_4_;
  bVar34 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._4_4_;
  bVar34 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._8_4_;
  bVar34 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._12_4_;
  auVar38 = vrcp14ps_avx512vl(auVar41);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar242 = ZEXT1664(auVar39);
  auVar40 = vfnmadd213ps_avx512vl(auVar41,auVar38,auVar39);
  auVar51 = vfmadd132ps_fma(auVar40,auVar38,auVar38);
  auVar38 = vrcp14ps_avx512vl(auVar44);
  auVar40 = vfnmadd213ps_avx512vl(auVar44,auVar38,auVar39);
  auVar50 = vfmadd132ps_fma(auVar40,auVar38,auVar38);
  auVar38 = vrcp14ps_avx512vl(auVar42);
  auVar39 = vfnmadd213ps_avx512vl(auVar42,auVar38,auVar39);
  auVar56 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar31 * 7 + 6);
  auVar38 = vpmovsxwd_avx(auVar38);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar49);
  auVar52._0_4_ = auVar51._0_4_ * auVar38._0_4_;
  auVar52._4_4_ = auVar51._4_4_ * auVar38._4_4_;
  auVar52._8_4_ = auVar51._8_4_ * auVar38._8_4_;
  auVar52._12_4_ = auVar51._12_4_ * auVar38._12_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar31 * 9 + 6);
  auVar38 = vpmovsxwd_avx(auVar39);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar49);
  auVar41 = vpbroadcastd_avx512vl();
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar39 = vpmovsxwd_avx(auVar40);
  auVar55._0_4_ = auVar51._0_4_ * auVar38._0_4_;
  auVar55._4_4_ = auVar51._4_4_ * auVar38._4_4_;
  auVar55._8_4_ = auVar51._8_4_ * auVar38._8_4_;
  auVar55._12_4_ = auVar51._12_4_ * auVar38._12_4_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar31 * -2 + 6);
  auVar38 = vpmovsxwd_avx(auVar51);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar48);
  auVar60._0_4_ = auVar50._0_4_ * auVar38._0_4_;
  auVar60._4_4_ = auVar50._4_4_ * auVar38._4_4_;
  auVar60._8_4_ = auVar50._8_4_ * auVar38._8_4_;
  auVar60._12_4_ = auVar50._12_4_ * auVar38._12_4_;
  auVar38 = vcvtdq2ps_avx(auVar39);
  auVar38 = vsubps_avx(auVar38,auVar48);
  auVar59._0_4_ = auVar50._0_4_ * auVar38._0_4_;
  auVar59._4_4_ = auVar50._4_4_ * auVar38._4_4_;
  auVar59._8_4_ = auVar50._8_4_ * auVar38._8_4_;
  auVar59._12_4_ = auVar50._12_4_ * auVar38._12_4_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar25 + uVar31 + 6);
  auVar38 = vpmovsxwd_avx(auVar50);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar10);
  auVar132._0_4_ = auVar56._0_4_ * auVar38._0_4_;
  auVar132._4_4_ = auVar56._4_4_ * auVar38._4_4_;
  auVar132._8_4_ = auVar56._8_4_ * auVar38._8_4_;
  auVar132._12_4_ = auVar56._12_4_ * auVar38._12_4_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar31 * 0x17 + 6);
  auVar38 = vpmovsxwd_avx(auVar49);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar10);
  auVar47._0_4_ = auVar56._0_4_ * auVar38._0_4_;
  auVar47._4_4_ = auVar56._4_4_ * auVar38._4_4_;
  auVar47._8_4_ = auVar56._8_4_ * auVar38._8_4_;
  auVar47._12_4_ = auVar56._12_4_ * auVar38._12_4_;
  auVar38 = vpminsd_avx(auVar52,auVar55);
  auVar39 = vpminsd_avx(auVar60,auVar59);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar39 = vpminsd_avx(auVar132,auVar47);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar56._4_4_ = uVar104;
  auVar56._0_4_ = uVar104;
  auVar56._8_4_ = uVar104;
  auVar56._12_4_ = uVar104;
  auVar39 = vmaxps_avx512vl(auVar39,auVar56);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar48._8_4_ = 0x3f7ffffa;
  auVar48._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar48._12_4_ = 0x3f7ffffa;
  local_2e8 = vmulps_avx512vl(auVar38,auVar48);
  auVar38 = vpmaxsd_avx(auVar52,auVar55);
  auVar39 = vpmaxsd_avx(auVar60,auVar59);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar39 = vpmaxsd_avx(auVar132,auVar47);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar10._4_4_ = uVar104;
  auVar10._0_4_ = uVar104;
  auVar10._8_4_ = uVar104;
  auVar10._12_4_ = uVar104;
  auVar39 = vminps_avx512vl(auVar39,auVar10);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar43._8_4_ = 0x3f800003;
  auVar43._0_8_ = 0x3f8000033f800003;
  auVar43._12_4_ = 0x3f800003;
  auVar38 = vmulps_avx512vl(auVar38,auVar43);
  uVar11 = vcmpps_avx512vl(local_2e8,auVar38,2);
  uVar37 = vpcmpgtd_avx512vl(auVar41,_DAT_01f7fcf0);
  uVar37 = ((byte)uVar11 & 0xf) & uVar37;
  if ((char)uVar37 == '\0') {
    return;
  }
  local_318 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar245 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar237 = ZEXT1664(auVar38);
  auVar244 = ZEXT464(0x3f800000);
  auVar38 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar243 = ZEXT1664(auVar38);
LAB_01ae0377:
  lVar27 = 0;
  for (uVar25 = uVar37; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar27 = lVar27 + 1;
  }
  uVar30 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar27 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar30].ptr;
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38 = *(undefined1 (*) [16])(_Var9 + uVar25 * (long)pvVar8);
  auVar39 = *(undefined1 (*) [16])(_Var9 + (uVar25 + 1) * (long)pvVar8);
  auVar40 = *(undefined1 (*) [16])(_Var9 + (uVar25 + 2) * (long)pvVar8);
  auVar51 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar25 + 3));
  lVar27 = *(long *)&pGVar6[1].time_range.upper;
  auVar50 = *(undefined1 (*) [16])(lVar27 + (long)p_Var7 * uVar25);
  auVar49 = *(undefined1 (*) [16])(lVar27 + (long)p_Var7 * (uVar25 + 1));
  auVar56 = *(undefined1 (*) [16])(lVar27 + (long)p_Var7 * (uVar25 + 2));
  uVar37 = uVar37 - 1 & uVar37;
  auVar48 = *(undefined1 (*) [16])(lVar27 + (long)p_Var7 * (uVar25 + 3));
  if (uVar37 != 0) {
    uVar31 = uVar37 - 1 & uVar37;
    for (uVar25 = uVar37; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    }
    if (uVar31 != 0) {
      for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar97 = *(float *)(ray + k * 4 + 0x30);
  auVar54 = auVar245._0_16_;
  auVar41 = vmulps_avx512vl(auVar48,auVar54);
  auVar105._0_12_ = ZEXT812(0);
  auVar105._12_4_ = 0;
  auVar43 = vfmadd213ps_fma(auVar105,auVar56,auVar41);
  auVar106._0_4_ = auVar49._0_4_ + auVar43._0_4_;
  auVar106._4_4_ = auVar49._4_4_ + auVar43._4_4_;
  auVar106._8_4_ = auVar49._8_4_ + auVar43._8_4_;
  auVar106._12_4_ = auVar49._12_4_ + auVar43._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar106,auVar50,auVar54);
  auVar61 = ZEXT816(0) << 0x40;
  auVar113._0_4_ = auVar48._0_4_ * 0.0;
  auVar113._4_4_ = auVar48._4_4_ * 0.0;
  auVar113._8_4_ = auVar48._8_4_ * 0.0;
  auVar113._12_4_ = auVar48._12_4_ * 0.0;
  auVar59 = auVar237._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar113,auVar56,auVar59);
  auVar43 = vfmadd231ps_fma(auVar43,auVar49,auVar61);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar50,auVar59);
  auVar45 = vmulps_avx512vl(auVar51,auVar54);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar40,auVar45);
  auVar219._0_4_ = auVar43._0_4_ + auVar39._0_4_;
  auVar219._4_4_ = auVar43._4_4_ + auVar39._4_4_;
  auVar219._8_4_ = auVar43._8_4_ + auVar39._8_4_;
  auVar219._12_4_ = auVar43._12_4_ + auVar39._12_4_;
  auVar46 = vfmadd231ps_avx512vl(auVar219,auVar38,auVar54);
  auVar228._0_4_ = auVar51._0_4_ * 0.0;
  auVar228._4_4_ = auVar51._4_4_ * 0.0;
  auVar228._8_4_ = auVar51._8_4_ * 0.0;
  auVar228._12_4_ = auVar51._12_4_ * 0.0;
  auVar43 = vfmadd231ps_avx512vl(auVar228,auVar40,auVar59);
  auVar43 = vfmadd231ps_fma(auVar43,auVar39,auVar61);
  auVar47 = vfnmadd231ps_avx512vl(auVar43,auVar38,auVar59);
  auVar123._0_4_ = auVar56._0_4_ + auVar41._0_4_;
  auVar123._4_4_ = auVar56._4_4_ + auVar41._4_4_;
  auVar123._8_4_ = auVar56._8_4_ + auVar41._8_4_;
  auVar123._12_4_ = auVar56._12_4_ + auVar41._12_4_;
  auVar43 = vfmadd231ps_fma(auVar123,auVar49,auVar61);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar54);
  auVar48 = vmulps_avx512vl(auVar48,auVar59);
  auVar56 = vfmadd231ps_fma(auVar48,auVar61,auVar56);
  auVar49 = vfnmadd231ps_avx512vl(auVar56,auVar59,auVar49);
  auVar56 = vfmadd231ps_fma(auVar49,auVar61,auVar50);
  auVar175._0_4_ = auVar45._0_4_ + auVar40._0_4_;
  auVar175._4_4_ = auVar45._4_4_ + auVar40._4_4_;
  auVar175._8_4_ = auVar45._8_4_ + auVar40._8_4_;
  auVar175._12_4_ = auVar45._12_4_ + auVar40._12_4_;
  auVar50 = vfmadd231ps_fma(auVar175,auVar39,auVar61);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar38,auVar54);
  auVar51 = vmulps_avx512vl(auVar51,auVar59);
  auVar40 = vfmadd231ps_fma(auVar51,auVar61,auVar40);
  auVar39 = vfnmadd231ps_avx512vl(auVar40,auVar59,auVar39);
  auVar49 = vfmadd231ps_fma(auVar39,auVar61,auVar38);
  auVar38 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar39 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar112 = auVar44._0_4_;
  auVar148._0_4_ = fVar112 * auVar39._0_4_;
  fVar120 = auVar44._4_4_;
  auVar148._4_4_ = fVar120 * auVar39._4_4_;
  fVar121 = auVar44._8_4_;
  auVar148._8_4_ = fVar121 * auVar39._8_4_;
  fVar122 = auVar44._12_4_;
  auVar148._12_4_ = fVar122 * auVar39._12_4_;
  auVar39 = vfmsub231ps_fma(auVar148,auVar38,auVar46);
  auVar40 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar149._0_4_ = fVar112 * auVar39._0_4_;
  auVar149._4_4_ = fVar120 * auVar39._4_4_;
  auVar149._8_4_ = fVar121 * auVar39._8_4_;
  auVar149._12_4_ = fVar122 * auVar39._12_4_;
  auVar38 = vfmsub231ps_fma(auVar149,auVar38,auVar47);
  auVar51 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar39 = vshufps_avx(auVar50,auVar50,0xc9);
  fVar131 = auVar56._0_4_;
  auVar140._0_4_ = fVar131 * auVar39._0_4_;
  fVar137 = auVar56._4_4_;
  auVar140._4_4_ = fVar137 * auVar39._4_4_;
  fVar138 = auVar56._8_4_;
  auVar140._8_4_ = fVar138 * auVar39._8_4_;
  fVar139 = auVar56._12_4_;
  auVar140._12_4_ = fVar139 * auVar39._12_4_;
  auVar39 = vfmsub231ps_fma(auVar140,auVar38,auVar50);
  auVar50 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar176._0_4_ = auVar39._0_4_ * fVar131;
  auVar176._4_4_ = auVar39._4_4_ * fVar137;
  auVar176._8_4_ = auVar39._8_4_ * fVar138;
  auVar176._12_4_ = auVar39._12_4_ * fVar139;
  auVar39 = vfmsub231ps_fma(auVar176,auVar38,auVar49);
  auVar38 = vdpps_avx(auVar40,auVar40,0x7f);
  auVar49 = vshufps_avx(auVar39,auVar39,0xc9);
  fVar194 = auVar38._0_4_;
  auVar177._4_12_ = ZEXT812(0) << 0x20;
  auVar177._0_4_ = fVar194;
  auVar39 = vrsqrt14ss_avx512f(auVar61,auVar177);
  auVar48 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar38,ZEXT416(0xbf000000));
  fVar205 = auVar39._0_4_;
  auVar39 = vdpps_avx(auVar40,auVar51,0x7f);
  fVar205 = auVar48._0_4_ + auVar41._0_4_ * fVar205 * fVar205 * fVar205;
  fVar206 = fVar205 * auVar40._0_4_;
  fVar215 = fVar205 * auVar40._4_4_;
  fVar216 = fVar205 * auVar40._8_4_;
  fVar217 = fVar205 * auVar40._12_4_;
  auVar187._0_4_ = auVar51._0_4_ * fVar194;
  auVar187._4_4_ = auVar51._4_4_ * fVar194;
  auVar187._8_4_ = auVar51._8_4_ * fVar194;
  auVar187._12_4_ = auVar51._12_4_ * fVar194;
  fVar194 = auVar39._0_4_;
  auVar160._0_4_ = fVar194 * auVar40._0_4_;
  auVar160._4_4_ = fVar194 * auVar40._4_4_;
  auVar160._8_4_ = fVar194 * auVar40._8_4_;
  auVar160._12_4_ = fVar194 * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar187,auVar160);
  auVar39 = vrcp14ss_avx512f(auVar61,auVar177);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar39,ZEXT416(0x40000000));
  fVar203 = auVar39._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar50,auVar50,0x7f);
  fVar204 = auVar38._0_4_;
  auVar178._4_12_ = ZEXT812(0) << 0x20;
  auVar178._0_4_ = fVar204;
  auVar39 = vrsqrt14ss_avx512f(auVar61,auVar178);
  auVar51 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar38,ZEXT416(0xbf000000));
  fVar194 = auVar39._0_4_;
  fVar194 = auVar51._0_4_ + auVar48._0_4_ * fVar194 * fVar194 * fVar194;
  auVar39 = vdpps_avx(auVar50,auVar49,0x7f);
  fVar218 = fVar194 * auVar50._0_4_;
  fVar225 = fVar194 * auVar50._4_4_;
  fVar226 = fVar194 * auVar50._8_4_;
  fVar227 = fVar194 * auVar50._12_4_;
  auVar150._0_4_ = fVar204 * auVar49._0_4_;
  auVar150._4_4_ = fVar204 * auVar49._4_4_;
  auVar150._8_4_ = fVar204 * auVar49._8_4_;
  auVar150._12_4_ = fVar204 * auVar49._12_4_;
  fVar204 = auVar39._0_4_;
  auVar141._0_4_ = fVar204 * auVar50._0_4_;
  auVar141._4_4_ = fVar204 * auVar50._4_4_;
  auVar141._8_4_ = fVar204 * auVar50._8_4_;
  auVar141._12_4_ = fVar204 * auVar50._12_4_;
  auVar51 = vsubps_avx(auVar150,auVar141);
  auVar39 = vrcp14ss_avx512f(auVar61,auVar178);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar39,ZEXT416(0x40000000));
  fVar204 = auVar38._0_4_ * auVar39._0_4_;
  auVar38 = vshufps_avx(auVar42,auVar42,0xff);
  auVar166._0_4_ = fVar206 * auVar38._0_4_;
  auVar166._4_4_ = fVar215 * auVar38._4_4_;
  auVar166._8_4_ = fVar216 * auVar38._8_4_;
  auVar166._12_4_ = fVar217 * auVar38._12_4_;
  local_228 = vsubps_avx(auVar42,auVar166);
  auVar39 = vshufps_avx(auVar44,auVar44,0xff);
  auVar151._0_4_ = auVar39._0_4_ * fVar206 + auVar38._0_4_ * fVar205 * fVar203 * auVar40._0_4_;
  auVar151._4_4_ = auVar39._4_4_ * fVar215 + auVar38._4_4_ * fVar205 * fVar203 * auVar40._4_4_;
  auVar151._8_4_ = auVar39._8_4_ * fVar216 + auVar38._8_4_ * fVar205 * fVar203 * auVar40._8_4_;
  auVar151._12_4_ = auVar39._12_4_ * fVar217 + auVar38._12_4_ * fVar205 * fVar203 * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar44,auVar151);
  local_238._0_4_ = auVar166._0_4_ + auVar42._0_4_;
  local_238._4_4_ = auVar166._4_4_ + auVar42._4_4_;
  fStack_230 = auVar166._8_4_ + auVar42._8_4_;
  fStack_22c = auVar166._12_4_ + auVar42._12_4_;
  auVar38 = vshufps_avx(auVar43,auVar43,0xff);
  auVar152._0_4_ = fVar218 * auVar38._0_4_;
  auVar152._4_4_ = fVar225 * auVar38._4_4_;
  auVar152._8_4_ = fVar226 * auVar38._8_4_;
  auVar152._12_4_ = fVar227 * auVar38._12_4_;
  local_248 = vsubps_avx512vl(auVar43,auVar152);
  auVar39 = vshufps_avx(auVar56,auVar56,0xff);
  auVar114._0_4_ = auVar39._0_4_ * fVar218 + auVar38._0_4_ * fVar194 * auVar51._0_4_ * fVar204;
  auVar114._4_4_ = auVar39._4_4_ * fVar225 + auVar38._4_4_ * fVar194 * auVar51._4_4_ * fVar204;
  auVar114._8_4_ = auVar39._8_4_ * fVar226 + auVar38._8_4_ * fVar194 * auVar51._8_4_ * fVar204;
  auVar114._12_4_ = auVar39._12_4_ * fVar227 + auVar38._12_4_ * fVar194 * auVar51._12_4_ * fVar204;
  auVar38 = vsubps_avx(auVar56,auVar114);
  local_258._0_4_ = auVar43._0_4_ + auVar152._0_4_;
  local_258._4_4_ = auVar43._4_4_ + auVar152._4_4_;
  fStack_250 = auVar43._8_4_ + auVar152._8_4_;
  fStack_24c = auVar43._12_4_ + auVar152._12_4_;
  auVar124._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar124._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar124._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar124._12_4_ = auVar40._12_4_ * 0.33333334;
  local_268 = vaddps_avx512vl(local_228,auVar124);
  auVar125._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar125._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar125._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar125._12_4_ = auVar38._12_4_ * 0.33333334;
  local_278 = vsubps_avx512vl(local_248,auVar125);
  auVar107._0_4_ = (fVar112 + auVar151._0_4_) * 0.33333334;
  auVar107._4_4_ = (fVar120 + auVar151._4_4_) * 0.33333334;
  auVar107._8_4_ = (fVar121 + auVar151._8_4_) * 0.33333334;
  auVar107._12_4_ = (fVar122 + auVar151._12_4_) * 0.33333334;
  _local_288 = vaddps_avx512vl(_local_238,auVar107);
  auVar108._0_4_ = (fVar131 + auVar114._0_4_) * 0.33333334;
  auVar108._4_4_ = (fVar137 + auVar114._4_4_) * 0.33333334;
  auVar108._8_4_ = (fVar138 + auVar114._8_4_) * 0.33333334;
  auVar108._12_4_ = (fVar139 + auVar114._12_4_) * 0.33333334;
  _local_298 = vsubps_avx512vl(_local_258,auVar108);
  local_1a8 = vsubps_avx(local_228,auVar10);
  uVar104 = local_1a8._0_4_;
  auVar115._4_4_ = uVar104;
  auVar115._0_4_ = uVar104;
  auVar115._8_4_ = uVar104;
  auVar115._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_1a8,local_1a8,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar39 = vshufps_avx(local_1a8,local_1a8,0xaa);
  fVar205 = pre->ray_space[k].vz.field_0.m128[0];
  fVar194 = pre->ray_space[k].vz.field_0.m128[1];
  fVar203 = pre->ray_space[k].vz.field_0.m128[2];
  fVar204 = pre->ray_space[k].vz.field_0.m128[3];
  auVar109._0_4_ = fVar205 * auVar39._0_4_;
  auVar109._4_4_ = fVar194 * auVar39._4_4_;
  auVar109._8_4_ = fVar203 * auVar39._8_4_;
  auVar109._12_4_ = fVar204 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar2,auVar38);
  auVar50 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar115);
  local_1b8 = vsubps_avx512vl(local_268,auVar10);
  uVar104 = local_1b8._0_4_;
  auVar126._4_4_ = uVar104;
  auVar126._0_4_ = uVar104;
  auVar126._8_4_ = uVar104;
  auVar126._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar39 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar116._0_4_ = fVar205 * auVar39._0_4_;
  auVar116._4_4_ = fVar194 * auVar39._4_4_;
  auVar116._8_4_ = fVar203 * auVar39._8_4_;
  auVar116._12_4_ = fVar204 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar2,auVar38);
  auVar49 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar126);
  local_1c8 = vsubps_avx512vl(local_278,auVar10);
  uVar104 = local_1c8._0_4_;
  auVar153._4_4_ = uVar104;
  auVar153._0_4_ = uVar104;
  auVar153._8_4_ = uVar104;
  auVar153._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar39 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar127._0_4_ = fVar205 * auVar39._0_4_;
  auVar127._4_4_ = fVar194 * auVar39._4_4_;
  auVar127._8_4_ = fVar203 * auVar39._8_4_;
  auVar127._12_4_ = fVar204 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar2,auVar38);
  auVar56 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar153);
  local_1d8 = vsubps_avx512vl(local_248,auVar10);
  uVar104 = local_1d8._0_4_;
  auVar167._4_4_ = uVar104;
  auVar167._0_4_ = uVar104;
  auVar167._8_4_ = uVar104;
  auVar167._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar39 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar154._0_4_ = fVar205 * auVar39._0_4_;
  auVar154._4_4_ = fVar194 * auVar39._4_4_;
  auVar154._8_4_ = fVar203 * auVar39._8_4_;
  auVar154._12_4_ = fVar204 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar2,auVar38);
  auVar48 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar167);
  local_1e8 = vsubps_avx(_local_238,auVar10);
  uVar104 = local_1e8._0_4_;
  auVar168._4_4_ = uVar104;
  auVar168._0_4_ = uVar104;
  auVar168._8_4_ = uVar104;
  auVar168._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar39 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar188._0_4_ = auVar39._0_4_ * fVar205;
  auVar188._4_4_ = auVar39._4_4_ * fVar194;
  auVar188._8_4_ = auVar39._8_4_ * fVar203;
  auVar188._12_4_ = auVar39._12_4_ * fVar204;
  auVar38 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar2,auVar38);
  auVar43 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar168);
  local_1f8 = vsubps_avx512vl(_local_288,auVar10);
  uVar104 = local_1f8._0_4_;
  auVar169._4_4_ = uVar104;
  auVar169._0_4_ = uVar104;
  auVar169._8_4_ = uVar104;
  auVar169._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar39 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar195._0_4_ = auVar39._0_4_ * fVar205;
  auVar195._4_4_ = auVar39._4_4_ * fVar194;
  auVar195._8_4_ = auVar39._8_4_ * fVar203;
  auVar195._12_4_ = auVar39._12_4_ * fVar204;
  auVar38 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar2,auVar38);
  auVar41 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar169);
  local_208 = vsubps_avx512vl(_local_298,auVar10);
  uVar104 = local_208._0_4_;
  auVar170._4_4_ = uVar104;
  auVar170._0_4_ = uVar104;
  auVar170._8_4_ = uVar104;
  auVar170._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_208,local_208,0x55);
  auVar39 = vshufps_avx(local_208,local_208,0xaa);
  auVar207._0_4_ = auVar39._0_4_ * fVar205;
  auVar207._4_4_ = auVar39._4_4_ * fVar194;
  auVar207._8_4_ = auVar39._8_4_ * fVar203;
  auVar207._12_4_ = auVar39._12_4_ * fVar204;
  auVar38 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar2,auVar38);
  auVar42 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar170);
  local_218 = vsubps_avx(_local_258,auVar10);
  uVar104 = local_218._0_4_;
  auVar98._4_4_ = uVar104;
  auVar98._0_4_ = uVar104;
  auVar98._8_4_ = uVar104;
  auVar98._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_218,local_218,0x55);
  auVar39 = vshufps_avx(local_218,local_218,0xaa);
  auVar161._0_4_ = auVar39._0_4_ * fVar205;
  auVar161._4_4_ = auVar39._4_4_ * fVar194;
  auVar161._8_4_ = auVar39._8_4_ * fVar203;
  auVar161._12_4_ = auVar39._12_4_ * fVar204;
  auVar38 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar2,auVar38);
  auVar10 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar98);
  auVar40 = vmovlhps_avx(auVar50,auVar43);
  local_338 = vmovlhps_avx(auVar49,auVar41);
  local_348 = vmovlhps_avx512f(auVar56,auVar42);
  _local_158 = vmovlhps_avx512f(auVar48,auVar10);
  auVar39 = vminps_avx(auVar40,local_338);
  auVar38 = vmaxps_avx(auVar40,local_338);
  auVar51 = vminps_avx512vl(local_348,_local_158);
  auVar39 = vminps_avx(auVar39,auVar51);
  auVar51 = vmaxps_avx512vl(local_348,_local_158);
  auVar38 = vmaxps_avx(auVar38,auVar51);
  auVar51 = vshufpd_avx(auVar39,auVar39,3);
  auVar39 = vminps_avx(auVar39,auVar51);
  auVar51 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vmaxps_avx(auVar38,auVar51);
  auVar39 = vandps_avx512vl(auVar39,auVar241._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar241._0_16_);
  auVar38 = vmaxps_avx(auVar39,auVar38);
  auVar39 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar39,auVar38);
  fVar205 = auVar38._0_4_ * 9.536743e-07;
  auVar39 = vmovddup_avx512vl(auVar50);
  auVar51 = vmovddup_avx512vl(auVar49);
  auVar50 = vmovddup_avx512vl(auVar56);
  auVar49 = vmovddup_avx512vl(auVar48);
  local_168 = ZEXT416((uint)fVar205);
  auVar99._4_4_ = fVar205;
  auVar99._0_4_ = fVar205;
  auVar99._8_4_ = fVar205;
  auVar99._12_4_ = fVar205;
  local_78._16_4_ = fVar205;
  local_78._0_16_ = auVar99;
  local_78._20_4_ = fVar205;
  local_78._24_4_ = fVar205;
  local_78._28_4_ = fVar205;
  auVar38 = vxorps_avx512vl(auVar99,auVar54);
  local_98 = auVar38._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_88 = local_98;
  uStack_84 = local_98;
  uStack_80 = local_98;
  uStack_7c = local_98;
  uVar25 = 0;
  local_178 = vsubps_avx(local_338,auVar40);
  local_188 = vsubps_avx512vl(local_348,local_338);
  local_198 = vsubps_avx512vl(_local_158,local_348);
  local_2a8 = vsubps_avx(_local_238,local_228);
  local_2b8 = vsubps_avx512vl(_local_288,local_268);
  local_2c8 = vsubps_avx512vl(_local_298,local_278);
  _local_2d8 = vsubps_avx512vl(_local_258,local_248);
  local_2f8 = vpbroadcastd_avx512vl();
  local_308 = vpbroadcastd_avx512vl();
  auVar38 = ZEXT816(0x3f80000000000000);
  auVar110 = auVar38;
LAB_01ae0ab7:
  do {
    auVar56 = vshufps_avx(auVar110,auVar110,0x50);
    auVar229._8_4_ = 0x3f800000;
    auVar229._0_8_ = 0x3f8000003f800000;
    auVar229._12_4_ = 0x3f800000;
    auVar85._16_4_ = 0x3f800000;
    auVar85._0_16_ = auVar229;
    auVar85._20_4_ = 0x3f800000;
    auVar85._24_4_ = 0x3f800000;
    auVar85._28_4_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar229,auVar56);
    fVar205 = auVar56._0_4_;
    fVar112 = auVar43._0_4_;
    auVar133._0_4_ = fVar112 * fVar205;
    fVar194 = auVar56._4_4_;
    fVar120 = auVar43._4_4_;
    auVar133._4_4_ = fVar120 * fVar194;
    fVar203 = auVar56._8_4_;
    auVar133._8_4_ = fVar112 * fVar203;
    fVar204 = auVar56._12_4_;
    auVar133._12_4_ = fVar120 * fVar204;
    fVar121 = auVar41._0_4_;
    auVar142._0_4_ = fVar121 * fVar205;
    fVar122 = auVar41._4_4_;
    auVar142._4_4_ = fVar122 * fVar194;
    auVar142._8_4_ = fVar121 * fVar203;
    auVar142._12_4_ = fVar122 * fVar204;
    fVar131 = auVar42._0_4_;
    auVar155._0_4_ = fVar131 * fVar205;
    fVar137 = auVar42._4_4_;
    auVar155._4_4_ = fVar137 * fVar194;
    auVar155._8_4_ = fVar131 * fVar203;
    auVar155._12_4_ = fVar137 * fVar204;
    fVar138 = auVar10._0_4_;
    auVar117._0_4_ = fVar138 * fVar205;
    fVar139 = auVar10._4_4_;
    auVar117._4_4_ = fVar139 * fVar194;
    auVar117._8_4_ = fVar138 * fVar203;
    auVar117._12_4_ = fVar139 * fVar204;
    auVar44 = vfmadd231ps_avx512vl(auVar133,auVar48,auVar39);
    auVar45 = vfmadd231ps_avx512vl(auVar142,auVar48,auVar51);
    auVar46 = vfmadd231ps_avx512vl(auVar155,auVar48,auVar50);
    auVar48 = vfmadd231ps_avx512vl(auVar117,auVar49,auVar48);
    auVar56 = vmovshdup_avx(auVar38);
    fVar194 = auVar38._0_4_;
    fVar205 = (auVar56._0_4_ - fVar194) * 0.04761905;
    auVar79._4_4_ = fVar194;
    auVar79._0_4_ = fVar194;
    auVar79._8_4_ = fVar194;
    auVar79._12_4_ = fVar194;
    auVar79._16_4_ = fVar194;
    auVar79._20_4_ = fVar194;
    auVar79._24_4_ = fVar194;
    auVar79._28_4_ = fVar194;
    auVar69._0_8_ = auVar56._0_8_;
    auVar69._8_8_ = auVar69._0_8_;
    auVar69._16_8_ = auVar69._0_8_;
    auVar69._24_8_ = auVar69._0_8_;
    auVar82 = vsubps_avx(auVar69,auVar79);
    uVar104 = auVar44._0_4_;
    auVar83._4_4_ = uVar104;
    auVar83._0_4_ = uVar104;
    auVar83._8_4_ = uVar104;
    auVar83._12_4_ = uVar104;
    auVar83._16_4_ = uVar104;
    auVar83._20_4_ = uVar104;
    auVar83._24_4_ = uVar104;
    auVar83._28_4_ = uVar104;
    auVar71._8_4_ = 1;
    auVar71._0_8_ = 0x100000001;
    auVar71._12_4_ = 1;
    auVar71._16_4_ = 1;
    auVar71._20_4_ = 1;
    auVar71._24_4_ = 1;
    auVar71._28_4_ = 1;
    auVar81 = ZEXT1632(auVar44);
    auVar80 = vpermps_avx2(auVar71,auVar81);
    auVar65 = vbroadcastss_avx512vl(auVar45);
    auVar75 = ZEXT1632(auVar45);
    auVar66 = vpermps_avx512vl(auVar71,auVar75);
    auVar67 = vbroadcastss_avx512vl(auVar46);
    auVar76 = ZEXT1632(auVar46);
    auVar68 = vpermps_avx512vl(auVar71,auVar76);
    auVar69 = vbroadcastss_avx512vl(auVar48);
    auVar78 = ZEXT1632(auVar48);
    auVar70 = vpermps_avx512vl(auVar71,auVar78);
    auVar84._4_4_ = fVar205;
    auVar84._0_4_ = fVar205;
    auVar84._8_4_ = fVar205;
    auVar84._12_4_ = fVar205;
    auVar84._16_4_ = fVar205;
    auVar84._20_4_ = fVar205;
    auVar84._24_4_ = fVar205;
    auVar84._28_4_ = fVar205;
    auVar77._8_4_ = 2;
    auVar77._0_8_ = 0x200000002;
    auVar77._12_4_ = 2;
    auVar77._16_4_ = 2;
    auVar77._20_4_ = 2;
    auVar77._24_4_ = 2;
    auVar77._28_4_ = 2;
    auVar71 = vpermps_avx512vl(auVar77,auVar81);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar73 = vpermps_avx512vl(auVar72,auVar81);
    auVar74 = vpermps_avx512vl(auVar77,auVar75);
    auVar75 = vpermps_avx512vl(auVar72,auVar75);
    auVar81 = vpermps_avx2(auVar77,auVar76);
    auVar76 = vpermps_avx512vl(auVar72,auVar76);
    auVar77 = vpermps_avx512vl(auVar77,auVar78);
    auVar72 = vpermps_avx512vl(auVar72,auVar78);
    auVar56 = vfmadd132ps_fma(auVar82,auVar79,_DAT_01faff20);
    auVar82 = vsubps_avx(auVar85,ZEXT1632(auVar56));
    auVar78 = vmulps_avx512vl(auVar65,ZEXT1632(auVar56));
    auVar85 = ZEXT1632(auVar56);
    auVar79 = vmulps_avx512vl(auVar66,auVar85);
    auVar48 = vfmadd231ps_fma(auVar78,auVar82,auVar83);
    auVar44 = vfmadd231ps_fma(auVar79,auVar82,auVar80);
    auVar78 = vmulps_avx512vl(auVar67,auVar85);
    auVar79 = vmulps_avx512vl(auVar68,auVar85);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar82,auVar65);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar82,auVar66);
    auVar65 = vmulps_avx512vl(auVar69,auVar85);
    auVar83 = ZEXT1632(auVar56);
    auVar66 = vmulps_avx512vl(auVar70,auVar83);
    auVar67 = vfmadd231ps_avx512vl(auVar65,auVar82,auVar67);
    auVar68 = vfmadd231ps_avx512vl(auVar66,auVar82,auVar68);
    fVar203 = auVar56._0_4_;
    fVar204 = auVar56._4_4_;
    auVar65._4_4_ = fVar204 * auVar78._4_4_;
    auVar65._0_4_ = fVar203 * auVar78._0_4_;
    fVar206 = auVar56._8_4_;
    auVar65._8_4_ = fVar206 * auVar78._8_4_;
    fVar215 = auVar56._12_4_;
    auVar65._12_4_ = fVar215 * auVar78._12_4_;
    auVar65._16_4_ = auVar78._16_4_ * 0.0;
    auVar65._20_4_ = auVar78._20_4_ * 0.0;
    auVar65._24_4_ = auVar78._24_4_ * 0.0;
    auVar65._28_4_ = fVar194;
    auVar66._4_4_ = fVar204 * auVar79._4_4_;
    auVar66._0_4_ = fVar203 * auVar79._0_4_;
    auVar66._8_4_ = fVar206 * auVar79._8_4_;
    auVar66._12_4_ = fVar215 * auVar79._12_4_;
    auVar66._16_4_ = auVar79._16_4_ * 0.0;
    auVar66._20_4_ = auVar79._20_4_ * 0.0;
    auVar66._24_4_ = auVar79._24_4_ * 0.0;
    auVar66._28_4_ = auVar80._28_4_;
    auVar48 = vfmadd231ps_fma(auVar65,auVar82,ZEXT1632(auVar48));
    auVar44 = vfmadd231ps_fma(auVar66,auVar82,ZEXT1632(auVar44));
    auVar70._0_4_ = fVar203 * auVar67._0_4_;
    auVar70._4_4_ = fVar204 * auVar67._4_4_;
    auVar70._8_4_ = fVar206 * auVar67._8_4_;
    auVar70._12_4_ = fVar215 * auVar67._12_4_;
    auVar70._16_4_ = auVar67._16_4_ * 0.0;
    auVar70._20_4_ = auVar67._20_4_ * 0.0;
    auVar70._24_4_ = auVar67._24_4_ * 0.0;
    auVar70._28_4_ = 0;
    auVar80._4_4_ = fVar204 * auVar68._4_4_;
    auVar80._0_4_ = fVar203 * auVar68._0_4_;
    auVar80._8_4_ = fVar206 * auVar68._8_4_;
    auVar80._12_4_ = fVar215 * auVar68._12_4_;
    auVar80._16_4_ = auVar68._16_4_ * 0.0;
    auVar80._20_4_ = auVar68._20_4_ * 0.0;
    auVar80._24_4_ = auVar68._24_4_ * 0.0;
    auVar80._28_4_ = auVar67._28_4_;
    auVar45 = vfmadd231ps_fma(auVar70,auVar82,auVar78);
    auVar46 = vfmadd231ps_fma(auVar80,auVar82,auVar79);
    auVar67._28_4_ = auVar79._28_4_;
    auVar67._0_28_ =
         ZEXT1628(CONCAT412(fVar215 * auVar46._12_4_,
                            CONCAT48(fVar206 * auVar46._8_4_,
                                     CONCAT44(fVar204 * auVar46._4_4_,fVar203 * auVar46._0_4_))));
    auVar47 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar215 * auVar45._12_4_,
                                                 CONCAT48(fVar206 * auVar45._8_4_,
                                                          CONCAT44(fVar204 * auVar45._4_4_,
                                                                   fVar203 * auVar45._0_4_)))),
                              auVar82,ZEXT1632(auVar48));
    auVar61 = vfmadd231ps_fma(auVar67,auVar82,ZEXT1632(auVar44));
    auVar80 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar48));
    auVar65 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar44));
    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar80 = vmulps_avx512vl(auVar80,auVar66);
    auVar65 = vmulps_avx512vl(auVar65,auVar66);
    auVar78._0_4_ = fVar205 * auVar80._0_4_;
    auVar78._4_4_ = fVar205 * auVar80._4_4_;
    auVar78._8_4_ = fVar205 * auVar80._8_4_;
    auVar78._12_4_ = fVar205 * auVar80._12_4_;
    auVar78._16_4_ = fVar205 * auVar80._16_4_;
    auVar78._20_4_ = fVar205 * auVar80._20_4_;
    auVar78._24_4_ = fVar205 * auVar80._24_4_;
    auVar78._28_4_ = 0;
    auVar80 = vmulps_avx512vl(auVar84,auVar65);
    auVar44 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
    auVar65 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_01feed00,ZEXT1632(auVar44));
    auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar61),_DAT_01feed00,ZEXT1632(auVar44));
    auVar119._0_4_ = auVar78._0_4_ + auVar47._0_4_;
    auVar119._4_4_ = auVar78._4_4_ + auVar47._4_4_;
    auVar119._8_4_ = auVar78._8_4_ + auVar47._8_4_;
    auVar119._12_4_ = auVar78._12_4_ + auVar47._12_4_;
    auVar119._16_4_ = auVar78._16_4_ + 0.0;
    auVar119._20_4_ = auVar78._20_4_ + 0.0;
    auVar119._24_4_ = auVar78._24_4_ + 0.0;
    auVar119._28_4_ = 0;
    auVar79 = ZEXT1632(auVar44);
    auVar68 = vpermt2ps_avx512vl(auVar78,_DAT_01feed00,auVar79);
    auVar69 = vaddps_avx512vl(ZEXT1632(auVar61),auVar80);
    auVar70 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar79);
    auVar80 = vsubps_avx(auVar65,auVar68);
    auVar70 = vsubps_avx512vl(auVar67,auVar70);
    auVar68 = vmulps_avx512vl(auVar74,auVar83);
    auVar78 = vmulps_avx512vl(auVar75,auVar83);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar82,auVar71);
    auVar71 = vfmadd231ps_avx512vl(auVar78,auVar82,auVar73);
    auVar73 = vmulps_avx512vl(auVar81,auVar83);
    auVar78 = vmulps_avx512vl(auVar76,auVar83);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar82,auVar74);
    auVar74 = vfmadd231ps_avx512vl(auVar78,auVar82,auVar75);
    auVar75 = vmulps_avx512vl(auVar77,auVar83);
    auVar72 = vmulps_avx512vl(auVar72,auVar83);
    auVar48 = vfmadd231ps_fma(auVar75,auVar82,auVar81);
    auVar81 = vfmadd231ps_avx512vl(auVar72,auVar82,auVar76);
    auVar72 = vmulps_avx512vl(auVar83,auVar73);
    auVar77 = ZEXT1632(auVar56);
    auVar75 = vmulps_avx512vl(auVar77,auVar74);
    auVar68 = vfmadd231ps_avx512vl(auVar72,auVar82,auVar68);
    auVar71 = vfmadd231ps_avx512vl(auVar75,auVar82,auVar71);
    auVar81 = vmulps_avx512vl(auVar77,auVar81);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar215 * auVar48._12_4_,
                                            CONCAT48(fVar206 * auVar48._8_4_,
                                                     CONCAT44(fVar204 * auVar48._4_4_,
                                                              fVar203 * auVar48._0_4_)))),auVar82,
                         auVar73);
    auVar73 = vfmadd231ps_avx512vl(auVar81,auVar82,auVar74);
    auVar81._4_4_ = fVar204 * auVar72._4_4_;
    auVar81._0_4_ = fVar203 * auVar72._0_4_;
    auVar81._8_4_ = fVar206 * auVar72._8_4_;
    auVar81._12_4_ = fVar215 * auVar72._12_4_;
    auVar81._16_4_ = auVar72._16_4_ * 0.0;
    auVar81._20_4_ = auVar72._20_4_ * 0.0;
    auVar81._24_4_ = auVar72._24_4_ * 0.0;
    auVar81._28_4_ = auVar76._28_4_;
    auVar74 = vmulps_avx512vl(auVar77,auVar73);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar82,auVar68);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar71,auVar82);
    auVar82 = vsubps_avx512vl(auVar72,auVar68);
    auVar68 = vsubps_avx512vl(auVar73,auVar71);
    auVar71 = vmulps_avx512vl(auVar82,auVar66);
    auVar66 = vmulps_avx512vl(auVar68,auVar66);
    fVar194 = fVar205 * auVar71._0_4_;
    fVar203 = fVar205 * auVar71._4_4_;
    auVar82._4_4_ = fVar203;
    auVar82._0_4_ = fVar194;
    fVar204 = fVar205 * auVar71._8_4_;
    auVar82._8_4_ = fVar204;
    fVar206 = fVar205 * auVar71._12_4_;
    auVar82._12_4_ = fVar206;
    fVar215 = fVar205 * auVar71._16_4_;
    auVar82._16_4_ = fVar215;
    fVar216 = fVar205 * auVar71._20_4_;
    auVar82._20_4_ = fVar216;
    fVar205 = fVar205 * auVar71._24_4_;
    auVar82._24_4_ = fVar205;
    auVar82._28_4_ = auVar71._28_4_;
    auVar66 = vmulps_avx512vl(auVar84,auVar66);
    auVar72 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,auVar79);
    auVar73 = vpermt2ps_avx512vl(auVar74,_DAT_01feed00,auVar79);
    auVar193._0_4_ = auVar81._0_4_ + fVar194;
    auVar193._4_4_ = auVar81._4_4_ + fVar203;
    auVar193._8_4_ = auVar81._8_4_ + fVar204;
    auVar193._12_4_ = auVar81._12_4_ + fVar206;
    auVar193._16_4_ = auVar81._16_4_ + fVar215;
    auVar193._20_4_ = auVar81._20_4_ + fVar216;
    auVar193._24_4_ = auVar81._24_4_ + fVar205;
    auVar193._28_4_ = auVar81._28_4_ + auVar71._28_4_;
    auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,ZEXT1632(auVar44));
    auVar71 = vaddps_avx512vl(auVar74,auVar66);
    auVar66 = vpermt2ps_avx512vl(auVar66,_DAT_01feed00,ZEXT1632(auVar44));
    auVar82 = vsubps_avx(auVar72,auVar82);
    auVar66 = vsubps_avx512vl(auVar73,auVar66);
    auVar86 = ZEXT1632(auVar47);
    auVar68 = vsubps_avx512vl(auVar81,auVar86);
    auVar88 = ZEXT1632(auVar61);
    auVar75 = vsubps_avx512vl(auVar74,auVar88);
    auVar76 = vsubps_avx512vl(auVar72,auVar65);
    auVar68 = vaddps_avx512vl(auVar68,auVar76);
    auVar76 = vsubps_avx512vl(auVar73,auVar67);
    auVar75 = vaddps_avx512vl(auVar75,auVar76);
    auVar76 = vmulps_avx512vl(auVar88,auVar68);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar86,auVar75);
    auVar77 = vmulps_avx512vl(auVar69,auVar68);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar119,auVar75);
    auVar78 = vmulps_avx512vl(auVar70,auVar68);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar80,auVar75);
    auVar79 = vmulps_avx512vl(auVar67,auVar68);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar65,auVar75);
    auVar83 = vmulps_avx512vl(auVar74,auVar68);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar81,auVar75);
    auVar84 = vmulps_avx512vl(auVar71,auVar68);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar193,auVar75);
    auVar85 = vmulps_avx512vl(auVar66,auVar68);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar82,auVar75);
    auVar68 = vmulps_avx512vl(auVar73,auVar68);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar72,auVar75);
    auVar75 = vminps_avx512vl(auVar76,auVar77);
    auVar76 = vmaxps_avx512vl(auVar76,auVar77);
    auVar77 = vminps_avx512vl(auVar78,auVar79);
    auVar75 = vminps_avx512vl(auVar75,auVar77);
    auVar77 = vmaxps_avx512vl(auVar78,auVar79);
    auVar76 = vmaxps_avx512vl(auVar76,auVar77);
    auVar77 = vminps_avx512vl(auVar83,auVar84);
    auVar78 = vmaxps_avx512vl(auVar83,auVar84);
    auVar79 = vminps_avx512vl(auVar85,auVar68);
    auVar77 = vminps_avx512vl(auVar77,auVar79);
    auVar75 = vminps_avx512vl(auVar75,auVar77);
    auVar68 = vmaxps_avx512vl(auVar85,auVar68);
    auVar68 = vmaxps_avx512vl(auVar78,auVar68);
    auVar76 = vmaxps_avx512vl(auVar76,auVar68);
    uVar11 = vcmpps_avx512vl(auVar75,local_78,2);
    auVar68._4_4_ = uStack_94;
    auVar68._0_4_ = local_98;
    auVar68._8_4_ = uStack_90;
    auVar68._12_4_ = uStack_8c;
    auVar68._16_4_ = uStack_88;
    auVar68._20_4_ = uStack_84;
    auVar68._24_4_ = uStack_80;
    auVar68._28_4_ = uStack_7c;
    uVar12 = vcmpps_avx512vl(auVar76,auVar68,5);
    bVar23 = (byte)uVar11 & (byte)uVar12 & 0x7f;
    if (bVar23 != 0) {
      auVar75 = vsubps_avx512vl(auVar65,auVar86);
      auVar76 = vsubps_avx512vl(auVar67,auVar88);
      auVar77 = vsubps_avx512vl(auVar72,auVar81);
      auVar75 = vaddps_avx512vl(auVar75,auVar77);
      auVar77 = vsubps_avx512vl(auVar73,auVar74);
      auVar76 = vaddps_avx512vl(auVar76,auVar77);
      auVar77 = vmulps_avx512vl(auVar88,auVar75);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar76,auVar86);
      auVar69 = vmulps_avx512vl(auVar69,auVar75);
      auVar69 = vfnmadd213ps_avx512vl(auVar119,auVar76,auVar69);
      auVar70 = vmulps_avx512vl(auVar70,auVar75);
      auVar70 = vfnmadd213ps_avx512vl(auVar80,auVar76,auVar70);
      auVar80 = vmulps_avx512vl(auVar67,auVar75);
      auVar67 = vfnmadd231ps_avx512vl(auVar80,auVar76,auVar65);
      auVar80 = vmulps_avx512vl(auVar74,auVar75);
      auVar74 = vfnmadd231ps_avx512vl(auVar80,auVar76,auVar81);
      auVar80 = vmulps_avx512vl(auVar71,auVar75);
      auVar71 = vfnmadd213ps_avx512vl(auVar193,auVar76,auVar80);
      auVar80 = vmulps_avx512vl(auVar66,auVar75);
      auVar78 = vfnmadd213ps_avx512vl(auVar82,auVar76,auVar80);
      auVar82 = vmulps_avx512vl(auVar73,auVar75);
      auVar72 = vfnmadd231ps_avx512vl(auVar82,auVar72,auVar76);
      auVar80 = vminps_avx(auVar77,auVar69);
      auVar82 = vmaxps_avx(auVar77,auVar69);
      auVar65 = vminps_avx(auVar70,auVar67);
      auVar65 = vminps_avx(auVar80,auVar65);
      auVar80 = vmaxps_avx(auVar70,auVar67);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      auVar81 = vminps_avx(auVar74,auVar71);
      auVar80 = vmaxps_avx(auVar74,auVar71);
      auVar66 = vminps_avx(auVar78,auVar72);
      auVar81 = vminps_avx(auVar81,auVar66);
      auVar81 = vminps_avx(auVar65,auVar81);
      auVar65 = vmaxps_avx(auVar78,auVar72);
      auVar80 = vmaxps_avx(auVar80,auVar65);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      uVar11 = vcmpps_avx512vl(auVar82,auVar68,5);
      uVar12 = vcmpps_avx512vl(auVar81,local_78,2);
      bVar23 = bVar23 & (byte)uVar11 & (byte)uVar12;
      if (bVar23 != 0) {
        auStack_328[uVar25] = (uint)bVar23;
        uVar11 = vmovlps_avx(auVar38);
        (&uStack_148)[uVar25] = uVar11;
        uVar31 = vmovlps_avx(auVar110);
        auStack_58[uVar25] = uVar31;
        uVar25 = (ulong)((int)uVar25 + 1);
      }
    }
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar237 = ZEXT1664(auVar38);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar238 = ZEXT3264(auVar82);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar239 = ZEXT1664(auVar38);
    auVar240 = ZEXT3264(_DAT_01feed20);
LAB_01ae0fc7:
    do {
      do {
        do {
          auVar48 = auVar242._0_16_;
          auVar56 = SUB6416(ZEXT464(0xb8d1b717),0);
          if ((int)uVar25 == 0) {
            uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar18._4_4_ = uVar104;
            auVar18._0_4_ = uVar104;
            auVar18._8_4_ = uVar104;
            auVar18._12_4_ = uVar104;
            uVar11 = vcmpps_avx512vl(local_2e8,auVar18,2);
            uVar30 = (uint)uVar37 & (uint)uVar11;
            uVar37 = (ulong)uVar30;
            if (uVar30 == 0) {
              return;
            }
            goto LAB_01ae0377;
          }
          uVar24 = (int)uVar25 - 1;
          uVar26 = (ulong)uVar24;
          uVar5 = auStack_328[uVar26];
          auVar110._8_8_ = 0;
          auVar110._0_8_ = auStack_58[uVar26];
          uVar31 = 0;
          for (uVar29 = (ulong)uVar5; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000)
          {
            uVar31 = uVar31 + 1;
          }
          uVar28 = uVar5 - 1 & uVar5;
          bVar34 = uVar28 == 0;
          auStack_328[uVar26] = uVar28;
          if (bVar34) {
            uVar25 = (ulong)uVar24;
          }
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar31;
          auVar38 = vpunpcklqdq_avx(auVar100,ZEXT416((int)uVar31 + 1));
          auVar38 = vcvtqq2ps_avx512vl(auVar38);
          auVar38 = vmulps_avx512vl(auVar38,auVar239._0_16_);
          uVar104 = *(undefined4 *)((long)&uStack_148 + uVar26 * 8 + 4);
          auVar13._4_4_ = uVar104;
          auVar13._0_4_ = uVar104;
          auVar13._8_4_ = uVar104;
          auVar13._12_4_ = uVar104;
          auVar44 = vmulps_avx512vl(auVar38,auVar13);
          auVar38 = vsubps_avx512vl(auVar48,auVar38);
          uVar104 = *(undefined4 *)(&uStack_148 + uVar26);
          auVar14._4_4_ = uVar104;
          auVar14._0_4_ = uVar104;
          auVar14._8_4_ = uVar104;
          auVar14._12_4_ = uVar104;
          auVar38 = vfmadd231ps_avx512vl(auVar44,auVar38,auVar14);
          auVar44 = vmovshdup_avx(auVar38);
          fVar205 = auVar44._0_4_ - auVar38._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar205));
          if (uVar5 == 0 || bVar34) goto LAB_01ae0ab7;
          auVar44 = vshufps_avx(auVar110,auVar110,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar205));
          bVar32 = (uint)uVar25 < 4;
          uVar24 = (uint)uVar25 - 4;
          bVar35 = uVar24 == 0;
          bVar33 = (POPCOUNT(uVar24 & 0xff) & 1U) == 0;
          auVar47 = vsubps_avx512vl(auVar48,auVar44);
          fVar194 = auVar44._0_4_;
          auVar143._0_4_ = fVar194 * fVar112;
          fVar203 = auVar44._4_4_;
          auVar143._4_4_ = fVar203 * fVar120;
          fVar204 = auVar44._8_4_;
          auVar143._8_4_ = fVar204 * fVar112;
          fVar206 = auVar44._12_4_;
          auVar143._12_4_ = fVar206 * fVar120;
          auVar156._0_4_ = fVar194 * fVar121;
          auVar156._4_4_ = fVar203 * fVar122;
          auVar156._8_4_ = fVar204 * fVar121;
          auVar156._12_4_ = fVar206 * fVar122;
          auVar162._0_4_ = fVar194 * fVar131;
          auVar162._4_4_ = fVar203 * fVar137;
          auVar162._8_4_ = fVar204 * fVar131;
          auVar162._12_4_ = fVar206 * fVar137;
          auVar128._0_4_ = fVar194 * fVar138;
          auVar128._4_4_ = fVar203 * fVar139;
          auVar128._8_4_ = fVar204 * fVar138;
          auVar128._12_4_ = fVar206 * fVar139;
          auVar44 = vfmadd231ps_fma(auVar143,auVar47,auVar39);
          auVar45 = vfmadd231ps_fma(auVar156,auVar47,auVar51);
          auVar46 = vfmadd231ps_fma(auVar162,auVar47,auVar50);
          auVar47 = vfmadd231ps_fma(auVar128,auVar47,auVar49);
          auVar73._16_16_ = auVar44;
          auVar73._0_16_ = auVar44;
          auVar74._16_16_ = auVar45;
          auVar74._0_16_ = auVar45;
          auVar76._16_16_ = auVar46;
          auVar76._0_16_ = auVar46;
          auVar80 = vpermps_avx512vl(auVar240._0_32_,ZEXT1632(auVar38));
          auVar82 = vsubps_avx(auVar74,auVar73);
          auVar45 = vfmadd213ps_fma(auVar82,auVar80,auVar73);
          auVar82 = vsubps_avx(auVar76,auVar74);
          auVar61 = vfmadd213ps_fma(auVar82,auVar80,auVar74);
          auVar44 = vsubps_avx(auVar47,auVar46);
          auVar75._16_16_ = auVar44;
          auVar75._0_16_ = auVar44;
          auVar44 = vfmadd213ps_fma(auVar75,auVar80,auVar76);
          auVar82 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar45));
          auVar45 = vfmadd213ps_fma(auVar82,auVar80,ZEXT1632(auVar45));
          auVar82 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar61));
          auVar44 = vfmadd213ps_fma(auVar82,auVar80,ZEXT1632(auVar61));
          auVar82 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar45));
          auVar132 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar82,auVar80);
          auVar82 = vmulps_avx512vl(auVar82,auVar238._0_32_);
          auVar72._16_16_ = auVar82._16_16_;
          auVar44 = vmulss_avx512f(ZEXT416((uint)fVar205),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar194 = auVar44._0_4_;
          auVar163._0_8_ =
               CONCAT44(auVar132._4_4_ + fVar194 * auVar82._4_4_,
                        auVar132._0_4_ + fVar194 * auVar82._0_4_);
          auVar163._8_4_ = auVar132._8_4_ + fVar194 * auVar82._8_4_;
          auVar163._12_4_ = auVar132._12_4_ + fVar194 * auVar82._12_4_;
          auVar144._0_4_ = fVar194 * auVar82._16_4_;
          auVar144._4_4_ = fVar194 * auVar82._20_4_;
          auVar144._8_4_ = fVar194 * auVar82._24_4_;
          auVar144._12_4_ = fVar194 * auVar82._28_4_;
          auVar58 = vsubps_avx((undefined1  [16])0x0,auVar144);
          auVar61 = vshufpd_avx(auVar132,auVar132,3);
          auVar59 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar44 = vsubps_avx(auVar61,auVar132);
          auVar45 = vsubps_avx(auVar59,(undefined1  [16])0x0);
          auVar179._0_4_ = auVar44._0_4_ + auVar45._0_4_;
          auVar179._4_4_ = auVar44._4_4_ + auVar45._4_4_;
          auVar179._8_4_ = auVar44._8_4_ + auVar45._8_4_;
          auVar179._12_4_ = auVar44._12_4_ + auVar45._12_4_;
          auVar44 = vshufps_avx(auVar132,auVar132,0xb1);
          auVar45 = vshufps_avx(auVar163,auVar163,0xb1);
          auVar46 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar47 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar230._4_4_ = auVar179._0_4_;
          auVar230._0_4_ = auVar179._0_4_;
          auVar230._8_4_ = auVar179._0_4_;
          auVar230._12_4_ = auVar179._0_4_;
          auVar54 = vshufps_avx(auVar179,auVar179,0x55);
          fVar194 = auVar54._0_4_;
          auVar189._0_4_ = auVar44._0_4_ * fVar194;
          fVar203 = auVar54._4_4_;
          auVar189._4_4_ = auVar44._4_4_ * fVar203;
          fVar204 = auVar54._8_4_;
          auVar189._8_4_ = auVar44._8_4_ * fVar204;
          fVar206 = auVar54._12_4_;
          auVar189._12_4_ = auVar44._12_4_ * fVar206;
          auVar196._0_4_ = auVar45._0_4_ * fVar194;
          auVar196._4_4_ = auVar45._4_4_ * fVar203;
          auVar196._8_4_ = auVar45._8_4_ * fVar204;
          auVar196._12_4_ = auVar45._12_4_ * fVar206;
          auVar208._0_4_ = auVar46._0_4_ * fVar194;
          auVar208._4_4_ = auVar46._4_4_ * fVar203;
          auVar208._8_4_ = auVar46._8_4_ * fVar204;
          auVar208._12_4_ = auVar46._12_4_ * fVar206;
          auVar180._0_4_ = auVar47._0_4_ * fVar194;
          auVar180._4_4_ = auVar47._4_4_ * fVar203;
          auVar180._8_4_ = auVar47._8_4_ * fVar204;
          auVar180._12_4_ = auVar47._12_4_ * fVar206;
          auVar44 = vfmadd231ps_fma(auVar189,auVar230,auVar132);
          auVar45 = vfmadd231ps_fma(auVar196,auVar230,auVar163);
          auVar57 = vfmadd231ps_fma(auVar208,auVar230,auVar58);
          auVar64 = vfmadd231ps_fma(auVar180,(undefined1  [16])0x0,auVar230);
          auVar54 = vshufpd_avx(auVar44,auVar44,1);
          auVar55 = vshufpd_avx(auVar45,auVar45,1);
          auVar52 = vshufpd_avx512vl(auVar57,auVar57,1);
          auVar53 = vshufpd_avx512vl(auVar64,auVar64,1);
          auVar46 = vminss_avx(auVar44,auVar45);
          auVar44 = vmaxss_avx(auVar45,auVar44);
          auVar47 = vminss_avx(auVar57,auVar64);
          auVar45 = vmaxss_avx(auVar64,auVar57);
          auVar46 = vminss_avx(auVar46,auVar47);
          auVar44 = vmaxss_avx(auVar45,auVar44);
          auVar47 = vminss_avx(auVar54,auVar55);
          auVar45 = vmaxss_avx(auVar55,auVar54);
          auVar54 = vminss_avx512f(auVar52,auVar53);
          auVar55 = vmaxss_avx512f(auVar53,auVar52);
          vmaxss_avx(auVar55,auVar45);
          auVar45 = vminss_avx512f(auVar47,auVar54);
          vucomiss_avx512f(auVar46);
          if ((!bVar32 && !bVar35) &&
             (auVar47 = vucomiss_avx512f(auVar56), bVar36 = bVar35, !bVar32 && !bVar35)) break;
          auVar47 = vucomiss_avx512f(auVar56);
          auVar54 = vucomiss_avx512f(auVar45);
          auVar44 = vucomiss_avx512f(auVar56);
          bVar36 = bVar32 || bVar35;
          bVar33 = bVar32 || bVar35;
          if (!bVar32 && !bVar35) break;
          uVar11 = vcmpps_avx512vl(auVar46,auVar54,5);
          uVar12 = vcmpps_avx512vl(auVar45,auVar54,5);
          uVar24 = (uint)uVar11 & (uint)uVar12;
          bVar19 = (uVar24 & 1) == 0;
          bVar36 = (!bVar32 && !bVar35) && bVar19;
          bVar33 = (!bVar32 && !bVar35) && (uVar24 & 1) == 0;
        } while ((bVar32 || bVar35) || !bVar19);
        auVar55 = auVar243._0_16_;
        vcmpss_avx512f(auVar46,auVar55,1);
        uVar11 = vcmpss_avx512f(auVar44,auVar55,1);
        bVar35 = (bool)((byte)uVar11 & 1);
        auVar72._0_16_ = auVar244._0_16_;
        auVar86._4_28_ = auVar72._4_28_;
        auVar86._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar244._0_4_);
        vucomiss_avx512f(auVar86._0_16_);
        bVar33 = (bool)(!bVar36 | bVar33);
        bVar36 = bVar33 == false;
        auVar88._16_16_ = auVar72._16_16_;
        auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar87._4_28_ = auVar88._4_28_;
        auVar87._0_4_ = (uint)bVar33 * auVar243._0_4_ + (uint)!bVar33 * 0x7f800000;
        auVar54 = auVar87._0_16_;
        auVar90._16_16_ = auVar72._16_16_;
        auVar90._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar33 * auVar243._0_4_ + (uint)!bVar33 * -0x800000;
        auVar56 = auVar89._0_16_;
        uVar11 = vcmpss_avx512f(auVar45,auVar55,1);
        bVar35 = (bool)((byte)uVar11 & 1);
        auVar92._16_16_ = auVar72._16_16_;
        auVar92._0_16_ = auVar244._0_16_;
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar244._0_4_);
        vucomiss_avx512f(auVar91._0_16_);
        if ((bVar33) || (bVar36)) {
          auVar45 = vucomiss_avx512f(auVar46);
          if ((bVar33) || (bVar36)) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar57 = vxorps_avx512vl(auVar46,auVar17);
            auVar45 = vsubss_avx512f(auVar45,auVar46);
            auVar45 = vdivss_avx512f(auVar57,auVar45);
            auVar46 = vsubss_avx512f(ZEXT416(0x3f800000),auVar45);
            auVar46 = vfmadd213ss_avx512f(auVar46,auVar55,auVar45);
            auVar45 = auVar46;
          }
          else {
            auVar45 = vxorps_avx512vl(auVar45,auVar45);
            vucomiss_avx512f(auVar45);
            auVar46 = ZEXT416(0x3f800000);
            if ((bVar33) || (bVar36)) {
              auVar46 = SUB6416(ZEXT464(0xff800000),0);
              auVar45 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar54 = vminss_avx512f(auVar54,auVar45);
          auVar56 = vmaxss_avx(auVar46,auVar56);
        }
        auVar244 = ZEXT464(0x3f800000);
        uVar11 = vcmpss_avx512f(auVar47,auVar55,1);
        bVar33 = (bool)((byte)uVar11 & 1);
        auVar45 = auVar244._0_16_;
        fVar194 = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * 0x3f800000);
        if ((auVar86._0_4_ != fVar194) || (NAN(auVar86._0_4_) || NAN(fVar194))) {
          fVar204 = auVar47._0_4_;
          fVar203 = auVar44._0_4_;
          if ((fVar204 != fVar203) || (NAN(fVar204) || NAN(fVar203))) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar44 = vxorps_avx512vl(auVar44,auVar16);
            auVar181._0_4_ = auVar44._0_4_ / (fVar204 - fVar203);
            auVar181._4_12_ = auVar44._4_12_;
            auVar44 = vsubss_avx512f(auVar45,auVar181);
            auVar44 = vfmadd213ss_avx512f(auVar44,auVar55,auVar181);
            auVar46 = auVar44;
          }
          else if ((fVar203 != 0.0) ||
                  (auVar44 = auVar45, auVar46 = ZEXT816(0) << 0x40, NAN(fVar203))) {
            auVar44 = SUB6416(ZEXT464(0xff800000),0);
            auVar46 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar54 = vminss_avx(auVar54,auVar46);
          auVar56 = vmaxss_avx(auVar44,auVar56);
        }
        bVar33 = auVar91._0_4_ != fVar194;
        auVar44 = vminss_avx512f(auVar54,auVar45);
        auVar94._16_16_ = auVar72._16_16_;
        auVar94._0_16_ = auVar54;
        auVar93._4_28_ = auVar94._4_28_;
        auVar93._0_4_ = (uint)bVar33 * auVar44._0_4_ + (uint)!bVar33 * auVar54._0_4_;
        auVar44 = vmaxss_avx512f(auVar45,auVar56);
        auVar96._16_16_ = auVar72._16_16_;
        auVar96._0_16_ = auVar56;
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar33 * auVar44._0_4_ + (uint)!bVar33 * auVar56._0_4_;
        auVar56 = vmaxss_avx512f(auVar55,auVar93._0_16_);
        auVar44 = vminss_avx512f(auVar95._0_16_,auVar45);
      } while (auVar44._0_4_ < auVar56._0_4_);
      auVar47 = vmaxss_avx512f(auVar55,ZEXT416((uint)(auVar56._0_4_ + -0.1)));
      auVar57 = vminss_avx512f(ZEXT416((uint)(auVar44._0_4_ + 0.1)),auVar45);
      auVar129._0_8_ = auVar132._0_8_;
      auVar129._8_8_ = auVar129._0_8_;
      auVar197._8_8_ = auVar163._0_8_;
      auVar197._0_8_ = auVar163._0_8_;
      auVar209._8_8_ = auVar58._0_8_;
      auVar209._0_8_ = auVar58._0_8_;
      auVar56 = vshufpd_avx(auVar163,auVar163,3);
      auVar44 = vshufpd_avx(auVar58,auVar58,3);
      auVar46 = vshufps_avx(auVar47,auVar57,0);
      auVar55 = vsubps_avx512vl(auVar48,auVar46);
      fVar194 = auVar46._0_4_;
      auVar157._0_4_ = fVar194 * auVar61._0_4_;
      fVar203 = auVar46._4_4_;
      auVar157._4_4_ = fVar203 * auVar61._4_4_;
      fVar204 = auVar46._8_4_;
      auVar157._8_4_ = fVar204 * auVar61._8_4_;
      fVar206 = auVar46._12_4_;
      auVar157._12_4_ = fVar206 * auVar61._12_4_;
      auVar164._0_4_ = fVar194 * auVar56._0_4_;
      auVar164._4_4_ = fVar203 * auVar56._4_4_;
      auVar164._8_4_ = fVar204 * auVar56._8_4_;
      auVar164._12_4_ = fVar206 * auVar56._12_4_;
      auVar233._0_4_ = auVar44._0_4_ * fVar194;
      auVar233._4_4_ = auVar44._4_4_ * fVar203;
      auVar233._8_4_ = auVar44._8_4_ * fVar204;
      auVar233._12_4_ = auVar44._12_4_ * fVar206;
      auVar145._0_4_ = fVar194 * auVar59._0_4_;
      auVar145._4_4_ = fVar203 * auVar59._4_4_;
      auVar145._8_4_ = fVar204 * auVar59._8_4_;
      auVar145._12_4_ = fVar206 * auVar59._12_4_;
      auVar61 = vfmadd231ps_fma(auVar157,auVar55,auVar129);
      auVar59 = vfmadd231ps_fma(auVar164,auVar55,auVar197);
      auVar54 = vfmadd231ps_fma(auVar233,auVar55,auVar209);
      auVar55 = vfmadd231ps_fma(auVar145,auVar55,ZEXT816(0));
      auVar44 = vsubss_avx512f(auVar45,auVar47);
      auVar56 = vmovshdup_avx(auVar110);
      auVar132 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * auVar47._0_4_)),auVar110,auVar44);
      auVar44 = vsubss_avx512f(auVar45,auVar57);
      auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * auVar57._0_4_)),auVar110,auVar44);
      auVar58 = vdivss_avx512f(auVar45,ZEXT416((uint)fVar205));
      auVar56 = vsubps_avx(auVar59,auVar61);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar46 = vmulps_avx512vl(auVar56,auVar57);
      auVar56 = vsubps_avx(auVar54,auVar59);
      auVar47 = vmulps_avx512vl(auVar56,auVar57);
      auVar56 = vsubps_avx(auVar55,auVar54);
      auVar56 = vmulps_avx512vl(auVar56,auVar57);
      auVar44 = vminps_avx(auVar47,auVar56);
      auVar56 = vmaxps_avx(auVar47,auVar56);
      auVar44 = vminps_avx(auVar46,auVar44);
      auVar56 = vmaxps_avx(auVar46,auVar56);
      auVar46 = vshufpd_avx(auVar44,auVar44,3);
      auVar47 = vshufpd_avx(auVar56,auVar56,3);
      auVar44 = vminps_avx(auVar44,auVar46);
      auVar56 = vmaxps_avx(auVar56,auVar47);
      fVar205 = auVar58._0_4_;
      auVar182._0_4_ = auVar44._0_4_ * fVar205;
      auVar182._4_4_ = auVar44._4_4_ * fVar205;
      auVar182._8_4_ = auVar44._8_4_ * fVar205;
      auVar182._12_4_ = auVar44._12_4_ * fVar205;
      auVar171._0_4_ = fVar205 * auVar56._0_4_;
      auVar171._4_4_ = fVar205 * auVar56._4_4_;
      auVar171._8_4_ = fVar205 * auVar56._8_4_;
      auVar171._12_4_ = fVar205 * auVar56._12_4_;
      auVar58 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar52._0_4_ - auVar132._0_4_)));
      auVar56 = vshufpd_avx(auVar61,auVar61,3);
      auVar44 = vshufpd_avx(auVar59,auVar59,3);
      auVar46 = vshufpd_avx(auVar54,auVar54,3);
      auVar47 = vshufpd_avx(auVar55,auVar55,3);
      auVar56 = vsubps_avx(auVar56,auVar61);
      auVar61 = vsubps_avx(auVar44,auVar59);
      auVar59 = vsubps_avx(auVar46,auVar54);
      auVar47 = vsubps_avx(auVar47,auVar55);
      auVar44 = vminps_avx(auVar56,auVar61);
      auVar56 = vmaxps_avx(auVar56,auVar61);
      auVar46 = vminps_avx(auVar59,auVar47);
      auVar46 = vminps_avx(auVar44,auVar46);
      auVar44 = vmaxps_avx(auVar59,auVar47);
      auVar56 = vmaxps_avx(auVar56,auVar44);
      fVar205 = auVar58._0_4_;
      auVar210._0_4_ = fVar205 * auVar46._0_4_;
      auVar210._4_4_ = fVar205 * auVar46._4_4_;
      auVar210._8_4_ = fVar205 * auVar46._8_4_;
      auVar210._12_4_ = fVar205 * auVar46._12_4_;
      auVar198._0_4_ = fVar205 * auVar56._0_4_;
      auVar198._4_4_ = fVar205 * auVar56._4_4_;
      auVar198._8_4_ = fVar205 * auVar56._8_4_;
      auVar198._12_4_ = fVar205 * auVar56._12_4_;
      auVar47 = vinsertps_avx(auVar38,auVar132,0x10);
      auVar53 = vpermt2ps_avx512vl(auVar38,_DAT_01feecd0,auVar52);
      auVar111._0_4_ = auVar47._0_4_ + auVar53._0_4_;
      auVar111._4_4_ = auVar47._4_4_ + auVar53._4_4_;
      auVar111._8_4_ = auVar47._8_4_ + auVar53._8_4_;
      auVar111._12_4_ = auVar47._12_4_ + auVar53._12_4_;
      auVar58 = vmulps_avx512vl(auVar111,auVar237._0_16_);
      auVar44 = vshufps_avx(auVar58,auVar58,0x54);
      uVar104 = auVar58._0_4_;
      auVar118._4_4_ = uVar104;
      auVar118._0_4_ = uVar104;
      auVar118._8_4_ = uVar104;
      auVar118._12_4_ = uVar104;
      auVar59 = vfmadd213ps_avx512vl(local_178,auVar118,auVar40);
      auVar46 = vfmadd213ps_fma(local_188,auVar118,local_338);
      auVar61 = vfmadd213ps_fma(local_198,auVar118,local_348);
      auVar56 = vsubps_avx(auVar46,auVar59);
      auVar59 = vfmadd213ps_fma(auVar56,auVar118,auVar59);
      auVar56 = vsubps_avx(auVar61,auVar46);
      auVar56 = vfmadd213ps_fma(auVar56,auVar118,auVar46);
      auVar56 = vsubps_avx(auVar56,auVar59);
      auVar46 = vfmadd231ps_fma(auVar59,auVar56,auVar118);
      auVar54 = vmulps_avx512vl(auVar56,auVar57);
      auVar220._8_8_ = auVar46._0_8_;
      auVar220._0_8_ = auVar46._0_8_;
      auVar56 = vshufpd_avx(auVar46,auVar46,3);
      auVar46 = vshufps_avx(auVar58,auVar58,0x55);
      auVar61 = vsubps_avx(auVar56,auVar220);
      auVar59 = vfmadd231ps_fma(auVar220,auVar46,auVar61);
      auVar234._8_8_ = auVar54._0_8_;
      auVar234._0_8_ = auVar54._0_8_;
      auVar56 = vshufpd_avx(auVar54,auVar54,3);
      auVar56 = vsubps_avx512vl(auVar56,auVar234);
      auVar56 = vfmadd213ps_avx512vl(auVar56,auVar46,auVar234);
      auVar46 = vxorps_avx512vl(auVar61,auVar245._0_16_);
      auVar54 = vmovshdup_avx512vl(auVar56);
      auVar55 = vxorps_avx512vl(auVar54,auVar245._0_16_);
      auVar57 = vmovshdup_avx512vl(auVar61);
      auVar55 = vpermt2ps_avx512vl(auVar55,ZEXT416(5),auVar61);
      auVar60 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar243 = ZEXT1664(auVar60);
      auVar61 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar61._0_4_)),auVar56,auVar57);
      auVar46 = vpermt2ps_avx512vl(auVar56,SUB6416(ZEXT464(4),0),auVar46);
      auVar146._0_4_ = auVar61._0_4_;
      auVar146._4_4_ = auVar146._0_4_;
      auVar146._8_4_ = auVar146._0_4_;
      auVar146._12_4_ = auVar146._0_4_;
      auVar56 = vdivps_avx(auVar55,auVar146);
      auVar62 = vdivps_avx512vl(auVar46,auVar146);
      fVar205 = auVar59._0_4_;
      auVar46 = vshufps_avx(auVar59,auVar59,0x55);
      auVar221._0_4_ = fVar205 * auVar56._0_4_ + auVar46._0_4_ * auVar62._0_4_;
      auVar221._4_4_ = fVar205 * auVar56._4_4_ + auVar46._4_4_ * auVar62._4_4_;
      auVar221._8_4_ = fVar205 * auVar56._8_4_ + auVar46._8_4_ * auVar62._8_4_;
      auVar221._12_4_ = fVar205 * auVar56._12_4_ + auVar46._12_4_ * auVar62._12_4_;
      auVar57 = vsubps_avx(auVar44,auVar221);
      auVar46 = vmovshdup_avx(auVar56);
      auVar44 = vinsertps_avx(auVar182,auVar210,0x1c);
      auVar235._0_4_ = auVar46._0_4_ * auVar44._0_4_;
      auVar235._4_4_ = auVar46._4_4_ * auVar44._4_4_;
      auVar235._8_4_ = auVar46._8_4_ * auVar44._8_4_;
      auVar235._12_4_ = auVar46._12_4_ * auVar44._12_4_;
      auVar64 = vinsertps_avx512f(auVar171,auVar198,0x1c);
      auVar46 = vmulps_avx512vl(auVar46,auVar64);
      auVar55 = vminps_avx512vl(auVar235,auVar46);
      auVar59 = vmaxps_avx(auVar46,auVar235);
      auVar54 = vmovshdup_avx(auVar62);
      auVar46 = vinsertps_avx(auVar210,auVar182,0x4c);
      auVar211._0_4_ = auVar54._0_4_ * auVar46._0_4_;
      auVar211._4_4_ = auVar54._4_4_ * auVar46._4_4_;
      auVar211._8_4_ = auVar54._8_4_ * auVar46._8_4_;
      auVar211._12_4_ = auVar54._12_4_ * auVar46._12_4_;
      auVar61 = vinsertps_avx(auVar198,auVar171,0x4c);
      auVar199._0_4_ = auVar54._0_4_ * auVar61._0_4_;
      auVar199._4_4_ = auVar54._4_4_ * auVar61._4_4_;
      auVar199._8_4_ = auVar54._8_4_ * auVar61._8_4_;
      auVar199._12_4_ = auVar54._12_4_ * auVar61._12_4_;
      auVar54 = vminps_avx(auVar211,auVar199);
      auVar55 = vaddps_avx512vl(auVar55,auVar54);
      auVar54 = vmaxps_avx(auVar199,auVar211);
      auVar200._0_4_ = auVar59._0_4_ + auVar54._0_4_;
      auVar200._4_4_ = auVar59._4_4_ + auVar54._4_4_;
      auVar200._8_4_ = auVar59._8_4_ + auVar54._8_4_;
      auVar200._12_4_ = auVar59._12_4_ + auVar54._12_4_;
      auVar212._8_8_ = 0x3f80000000000000;
      auVar212._0_8_ = 0x3f80000000000000;
      auVar59 = vsubps_avx(auVar212,auVar200);
      auVar54 = vsubps_avx(auVar212,auVar55);
      auVar55 = vsubps_avx(auVar47,auVar58);
      auVar58 = vsubps_avx(auVar53,auVar58);
      fVar206 = auVar55._0_4_;
      auVar236._0_4_ = fVar206 * auVar59._0_4_;
      fVar215 = auVar55._4_4_;
      auVar236._4_4_ = fVar215 * auVar59._4_4_;
      fVar216 = auVar55._8_4_;
      auVar236._8_4_ = fVar216 * auVar59._8_4_;
      fVar217 = auVar55._12_4_;
      auVar236._12_4_ = fVar217 * auVar59._12_4_;
      auVar63 = vbroadcastss_avx512vl(auVar56);
      auVar44 = vmulps_avx512vl(auVar63,auVar44);
      auVar64 = vmulps_avx512vl(auVar63,auVar64);
      auVar63 = vminps_avx512vl(auVar44,auVar64);
      auVar64 = vmaxps_avx512vl(auVar64,auVar44);
      auVar44 = vbroadcastss_avx512vl(auVar62);
      auVar46 = vmulps_avx512vl(auVar44,auVar46);
      auVar44 = vmulps_avx512vl(auVar44,auVar61);
      auVar61 = vminps_avx512vl(auVar46,auVar44);
      auVar61 = vaddps_avx512vl(auVar63,auVar61);
      auVar55 = vmulps_avx512vl(auVar55,auVar54);
      fVar205 = auVar58._0_4_;
      auVar201._0_4_ = fVar205 * auVar59._0_4_;
      fVar194 = auVar58._4_4_;
      auVar201._4_4_ = fVar194 * auVar59._4_4_;
      fVar203 = auVar58._8_4_;
      auVar201._8_4_ = fVar203 * auVar59._8_4_;
      fVar204 = auVar58._12_4_;
      auVar201._12_4_ = fVar204 * auVar59._12_4_;
      auVar213._0_4_ = fVar205 * auVar54._0_4_;
      auVar213._4_4_ = fVar194 * auVar54._4_4_;
      auVar213._8_4_ = fVar203 * auVar54._8_4_;
      auVar213._12_4_ = fVar204 * auVar54._12_4_;
      auVar44 = vmaxps_avx(auVar44,auVar46);
      auVar172._0_4_ = auVar64._0_4_ + auVar44._0_4_;
      auVar172._4_4_ = auVar64._4_4_ + auVar44._4_4_;
      auVar172._8_4_ = auVar64._8_4_ + auVar44._8_4_;
      auVar172._12_4_ = auVar64._12_4_ + auVar44._12_4_;
      auVar183._8_8_ = 0x3f800000;
      auVar183._0_8_ = 0x3f800000;
      auVar44 = vsubps_avx(auVar183,auVar172);
      auVar46 = vsubps_avx512vl(auVar183,auVar61);
      auVar231._0_4_ = fVar206 * auVar44._0_4_;
      auVar231._4_4_ = fVar215 * auVar44._4_4_;
      auVar231._8_4_ = fVar216 * auVar44._8_4_;
      auVar231._12_4_ = fVar217 * auVar44._12_4_;
      auVar222._0_4_ = fVar206 * auVar46._0_4_;
      auVar222._4_4_ = fVar215 * auVar46._4_4_;
      auVar222._8_4_ = fVar216 * auVar46._8_4_;
      auVar222._12_4_ = fVar217 * auVar46._12_4_;
      auVar173._0_4_ = fVar205 * auVar44._0_4_;
      auVar173._4_4_ = fVar194 * auVar44._4_4_;
      auVar173._8_4_ = fVar203 * auVar44._8_4_;
      auVar173._12_4_ = fVar204 * auVar44._12_4_;
      auVar184._0_4_ = fVar205 * auVar46._0_4_;
      auVar184._4_4_ = fVar194 * auVar46._4_4_;
      auVar184._8_4_ = fVar203 * auVar46._8_4_;
      auVar184._12_4_ = fVar204 * auVar46._12_4_;
      auVar44 = vminps_avx(auVar231,auVar222);
      auVar46 = vminps_avx512vl(auVar173,auVar184);
      auVar61 = vminps_avx512vl(auVar44,auVar46);
      auVar44 = vmaxps_avx(auVar222,auVar231);
      auVar46 = vmaxps_avx(auVar184,auVar173);
      auVar46 = vmaxps_avx(auVar46,auVar44);
      auVar59 = vminps_avx512vl(auVar236,auVar55);
      auVar44 = vminps_avx(auVar201,auVar213);
      auVar44 = vminps_avx(auVar59,auVar44);
      auVar44 = vhaddps_avx(auVar61,auVar44);
      auVar59 = vmaxps_avx512vl(auVar55,auVar236);
      auVar61 = vmaxps_avx(auVar213,auVar201);
      auVar61 = vmaxps_avx(auVar61,auVar59);
      auVar46 = vhaddps_avx(auVar46,auVar61);
      auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
      auVar46 = vshufps_avx(auVar46,auVar46,0xe8);
      auVar174._0_4_ = auVar44._0_4_ + auVar57._0_4_;
      auVar174._4_4_ = auVar44._4_4_ + auVar57._4_4_;
      auVar174._8_4_ = auVar44._8_4_ + auVar57._8_4_;
      auVar174._12_4_ = auVar44._12_4_ + auVar57._12_4_;
      auVar185._0_4_ = auVar46._0_4_ + auVar57._0_4_;
      auVar185._4_4_ = auVar46._4_4_ + auVar57._4_4_;
      auVar185._8_4_ = auVar46._8_4_ + auVar57._8_4_;
      auVar185._12_4_ = auVar46._12_4_ + auVar57._12_4_;
      auVar44 = vmaxps_avx(auVar47,auVar174);
      auVar46 = vminps_avx(auVar185,auVar53);
      uVar31 = vcmpps_avx512vl(auVar46,auVar44,1);
    } while ((uVar31 & 3) != 0);
    uVar31 = vcmpps_avx512vl(auVar185,auVar53,1);
    uVar11 = vcmpps_avx512vl(auVar38,auVar174,1);
    if (((ushort)uVar11 & (ushort)uVar31 & 1) == 0) {
      bVar23 = 0;
    }
    else {
      auVar44 = vmovshdup_avx(auVar174);
      bVar23 = auVar132._0_4_ < auVar44._0_4_ & (byte)(uVar31 >> 1) & 0x7f;
    }
    if (((!bVar32 || uVar5 != 0 && !bVar34) | bVar23) == 1) {
      lVar27 = 200;
      do {
        auVar38 = vsubss_avx512f(auVar45,auVar57);
        fVar203 = auVar38._0_4_;
        fVar205 = fVar203 * fVar203 * fVar203;
        fVar204 = auVar57._0_4_;
        fVar194 = fVar204 * 3.0 * fVar203 * fVar203;
        fVar203 = fVar203 * fVar204 * fVar204 * 3.0;
        auVar134._4_4_ = fVar205;
        auVar134._0_4_ = fVar205;
        auVar134._8_4_ = fVar205;
        auVar134._12_4_ = fVar205;
        auVar130._4_4_ = fVar194;
        auVar130._0_4_ = fVar194;
        auVar130._8_4_ = fVar194;
        auVar130._12_4_ = fVar194;
        auVar101._4_4_ = fVar203;
        auVar101._0_4_ = fVar203;
        auVar101._8_4_ = fVar203;
        auVar101._12_4_ = fVar203;
        fVar204 = fVar204 * fVar204 * fVar204;
        auVar158._0_4_ = fVar204 * (float)local_158._0_4_;
        auVar158._4_4_ = fVar204 * (float)local_158._4_4_;
        auVar158._8_4_ = fVar204 * fStack_150;
        auVar158._12_4_ = fVar204 * fStack_14c;
        auVar38 = vfmadd231ps_fma(auVar158,local_348,auVar101);
        auVar38 = vfmadd231ps_fma(auVar38,local_338,auVar130);
        auVar38 = vfmadd231ps_fma(auVar38,auVar40,auVar134);
        auVar102._8_8_ = auVar38._0_8_;
        auVar102._0_8_ = auVar38._0_8_;
        auVar38 = vshufpd_avx(auVar38,auVar38,3);
        auVar44 = vshufps_avx(auVar57,auVar57,0x55);
        auVar38 = vsubps_avx(auVar38,auVar102);
        auVar44 = vfmadd213ps_fma(auVar38,auVar44,auVar102);
        fVar205 = auVar44._0_4_;
        auVar38 = vshufps_avx(auVar44,auVar44,0x55);
        auVar103._0_4_ = auVar56._0_4_ * fVar205 + auVar62._0_4_ * auVar38._0_4_;
        auVar103._4_4_ = auVar56._4_4_ * fVar205 + auVar62._4_4_ * auVar38._4_4_;
        auVar103._8_4_ = auVar56._8_4_ * fVar205 + auVar62._8_4_ * auVar38._8_4_;
        auVar103._12_4_ = auVar56._12_4_ * fVar205 + auVar62._12_4_ * auVar38._12_4_;
        auVar57 = vsubps_avx(auVar57,auVar103);
        auVar38 = vandps_avx512vl(auVar44,auVar241._0_16_);
        auVar44 = vprolq_avx512vl(auVar38,0x20);
        auVar38 = vmaxss_avx(auVar44,auVar38);
        bVar34 = (float)local_168._0_4_ < auVar38._0_4_;
        if (auVar38._0_4_ < (float)local_168._0_4_) {
          auVar38 = vucomiss_avx512f(auVar60);
          if (bVar34) break;
          auVar56 = vucomiss_avx512f(auVar38);
          auVar244 = ZEXT1664(auVar56);
          if (bVar34) break;
          vmovshdup_avx(auVar38);
          auVar56 = vucomiss_avx512f(auVar60);
          if (bVar34) break;
          auVar44 = vucomiss_avx512f(auVar56);
          auVar244 = ZEXT1664(auVar44);
          if (bVar34) break;
          auVar45 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar58 = vinsertps_avx(auVar45,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar45 = vdpps_avx(auVar58,local_1a8,0x7f);
          auVar46 = vdpps_avx(auVar58,local_1b8,0x7f);
          auVar47 = vdpps_avx(auVar58,local_1c8,0x7f);
          auVar61 = vdpps_avx(auVar58,local_1d8,0x7f);
          auVar59 = vdpps_avx(auVar58,local_1e8,0x7f);
          auVar54 = vdpps_avx(auVar58,local_1f8,0x7f);
          auVar55 = vdpps_avx(auVar58,local_208,0x7f);
          auVar58 = vdpps_avx(auVar58,local_218,0x7f);
          auVar57 = vsubss_avx512f(auVar44,auVar56);
          fVar204 = auVar56._0_4_;
          auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar59._0_4_)),auVar57,auVar45);
          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar204)),auVar57,auVar46);
          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar204)),auVar57,auVar47);
          auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar58._0_4_)),auVar57,auVar61);
          auVar44 = vsubss_avx512f(auVar44,auVar38);
          auVar186._0_4_ = auVar44._0_4_;
          fVar205 = auVar186._0_4_ * auVar186._0_4_ * auVar186._0_4_;
          local_f8 = auVar38._0_4_;
          fVar194 = local_f8 * 3.0 * auVar186._0_4_ * auVar186._0_4_;
          fVar203 = auVar186._0_4_ * local_f8 * local_f8 * 3.0;
          fVar215 = local_f8 * local_f8 * local_f8;
          auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar47._0_4_)),ZEXT416((uint)fVar203),
                                    auVar46);
          auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar194),auVar45);
          auVar56 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar205),auVar56);
          fVar206 = auVar56._0_4_;
          if ((fVar206 < fVar97) || (fVar216 = *(float *)(ray + k * 4 + 0x80), fVar216 < fVar206))
          break;
          local_e8 = vshufps_avx(auVar38,auVar38,0x55);
          auVar44 = vsubps_avx512vl(auVar48,local_e8);
          fVar217 = local_e8._0_4_;
          auVar190._0_4_ = fVar217 * (float)local_238._0_4_;
          fVar218 = local_e8._4_4_;
          auVar190._4_4_ = fVar218 * (float)local_238._4_4_;
          fVar225 = local_e8._8_4_;
          auVar190._8_4_ = fVar225 * fStack_230;
          fVar226 = local_e8._12_4_;
          auVar190._12_4_ = fVar226 * fStack_22c;
          auVar202._0_4_ = fVar217 * (float)local_288._0_4_;
          auVar202._4_4_ = fVar218 * (float)local_288._4_4_;
          auVar202._8_4_ = fVar225 * fStack_280;
          auVar202._12_4_ = fVar226 * fStack_27c;
          auVar214._0_4_ = fVar217 * (float)local_298._0_4_;
          auVar214._4_4_ = fVar218 * (float)local_298._4_4_;
          auVar214._8_4_ = fVar225 * fStack_290;
          auVar214._12_4_ = fVar226 * fStack_28c;
          auVar223._0_4_ = fVar217 * (float)local_258._0_4_;
          auVar223._4_4_ = fVar218 * (float)local_258._4_4_;
          auVar223._8_4_ = fVar225 * fStack_250;
          auVar223._12_4_ = fVar226 * fStack_24c;
          auVar38 = vfmadd231ps_fma(auVar190,auVar44,local_228);
          auVar56 = vfmadd231ps_fma(auVar202,auVar44,local_268);
          auVar48 = vfmadd231ps_fma(auVar214,auVar44,local_278);
          auVar44 = vfmadd231ps_fma(auVar223,auVar44,local_248);
          auVar38 = vsubps_avx(auVar56,auVar38);
          auVar56 = vsubps_avx(auVar48,auVar56);
          auVar48 = vsubps_avx(auVar44,auVar48);
          auVar224._0_4_ = local_f8 * auVar56._0_4_;
          auVar224._4_4_ = local_f8 * auVar56._4_4_;
          auVar224._8_4_ = local_f8 * auVar56._8_4_;
          auVar224._12_4_ = local_f8 * auVar56._12_4_;
          auVar186._4_4_ = auVar186._0_4_;
          auVar186._8_4_ = auVar186._0_4_;
          auVar186._12_4_ = auVar186._0_4_;
          auVar38 = vfmadd231ps_fma(auVar224,auVar186,auVar38);
          auVar191._0_4_ = local_f8 * auVar48._0_4_;
          auVar191._4_4_ = local_f8 * auVar48._4_4_;
          auVar191._8_4_ = local_f8 * auVar48._8_4_;
          auVar191._12_4_ = local_f8 * auVar48._12_4_;
          auVar56 = vfmadd231ps_fma(auVar191,auVar186,auVar56);
          auVar192._0_4_ = local_f8 * auVar56._0_4_;
          auVar192._4_4_ = local_f8 * auVar56._4_4_;
          auVar192._8_4_ = local_f8 * auVar56._8_4_;
          auVar192._12_4_ = local_f8 * auVar56._12_4_;
          auVar38 = vfmadd231ps_fma(auVar192,auVar186,auVar38);
          auVar15._8_4_ = 0x40400000;
          auVar15._0_8_ = 0x4040000040400000;
          auVar15._12_4_ = 0x40400000;
          auVar38 = vmulps_avx512vl(auVar38,auVar15);
          pGVar6 = (context->scene->geometries).items[uVar30].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
          auVar165._0_4_ = fVar215 * (float)local_2d8._0_4_;
          auVar165._4_4_ = fVar215 * (float)local_2d8._4_4_;
          auVar165._8_4_ = fVar215 * fStack_2d0;
          auVar165._12_4_ = fVar215 * fStack_2cc;
          auVar159._4_4_ = fVar203;
          auVar159._0_4_ = fVar203;
          auVar159._8_4_ = fVar203;
          auVar159._12_4_ = fVar203;
          auVar56 = vfmadd132ps_fma(auVar159,auVar165,local_2c8);
          auVar147._4_4_ = fVar194;
          auVar147._0_4_ = fVar194;
          auVar147._8_4_ = fVar194;
          auVar147._12_4_ = fVar194;
          auVar56 = vfmadd132ps_fma(auVar147,auVar56,local_2b8);
          auVar135._4_4_ = fVar205;
          auVar135._0_4_ = fVar205;
          auVar135._8_4_ = fVar205;
          auVar135._12_4_ = fVar205;
          auVar44 = vfmadd132ps_fma(auVar135,auVar56,local_2a8);
          auVar56 = vshufps_avx(auVar44,auVar44,0xc9);
          auVar48 = vshufps_avx(auVar38,auVar38,0xc9);
          auVar136._0_4_ = auVar44._0_4_ * auVar48._0_4_;
          auVar136._4_4_ = auVar44._4_4_ * auVar48._4_4_;
          auVar136._8_4_ = auVar44._8_4_ * auVar48._8_4_;
          auVar136._12_4_ = auVar44._12_4_ * auVar48._12_4_;
          auVar38 = vfmsub231ps_fma(auVar136,auVar38,auVar56);
          local_108 = auVar38._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar206;
            uVar104 = vextractps_avx(auVar38,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar104;
            uVar104 = vextractps_avx(auVar38,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar104;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_108;
            *(float *)(ray + k * 4 + 0xf0) = local_f8;
            *(float *)(ray + k * 4 + 0x100) = fVar204;
            *(uint *)(ray + k * 4 + 0x110) = uVar4;
            *(uint *)(ray + k * 4 + 0x120) = uVar30;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            break;
          }
          auVar56 = vshufps_avx(auVar38,auVar38,0x55);
          local_118 = vshufps_avx(auVar38,auVar38,0xaa);
          local_128[0] = (RTCHitN)auVar56[0];
          local_128[1] = (RTCHitN)auVar56[1];
          local_128[2] = (RTCHitN)auVar56[2];
          local_128[3] = (RTCHitN)auVar56[3];
          local_128[4] = (RTCHitN)auVar56[4];
          local_128[5] = (RTCHitN)auVar56[5];
          local_128[6] = (RTCHitN)auVar56[6];
          local_128[7] = (RTCHitN)auVar56[7];
          local_128[8] = (RTCHitN)auVar56[8];
          local_128[9] = (RTCHitN)auVar56[9];
          local_128[10] = (RTCHitN)auVar56[10];
          local_128[0xb] = (RTCHitN)auVar56[0xb];
          local_128[0xc] = (RTCHitN)auVar56[0xc];
          local_128[0xd] = (RTCHitN)auVar56[0xd];
          local_128[0xe] = (RTCHitN)auVar56[0xe];
          local_128[0xf] = (RTCHitN)auVar56[0xf];
          uStack_104 = local_108;
          uStack_100 = local_108;
          uStack_fc = local_108;
          fStack_f4 = local_f8;
          fStack_f0 = local_f8;
          fStack_ec = local_f8;
          local_d8 = local_308._0_8_;
          uStack_d0 = local_308._8_8_;
          local_c8 = local_2f8;
          vpcmpeqd_avx2(ZEXT1632(local_2f8),ZEXT1632(local_2f8));
          uStack_b4 = context->user->instID[0];
          local_b8 = uStack_b4;
          uStack_b0 = uStack_b4;
          uStack_ac = uStack_b4;
          uStack_a8 = context->user->instPrimID[0];
          uStack_a4 = uStack_a8;
          uStack_a0 = uStack_a8;
          uStack_9c = uStack_a8;
          *(float *)(ray + k * 4 + 0x80) = fVar206;
          local_388 = local_318;
          local_378.valid = (int *)local_388;
          local_378.geometryUserPtr = pGVar6->userPtr;
          local_378.context = context->user;
          local_378.hit = local_128;
          local_378.N = 4;
          local_378.ray = (RTCRayN *)ray;
          if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->intersectionFilterN)(&local_378);
            auVar38 = vxorps_avx512vl(auVar60,auVar60);
            auVar243 = ZEXT1664(auVar38);
            auVar244 = ZEXT464(0x3f800000);
            auVar240 = ZEXT3264(_DAT_01feed20);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
            auVar239 = ZEXT1664(auVar38);
            auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
            auVar238 = ZEXT3264(auVar82);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar237 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar245 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar242 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar241 = ZEXT1664(auVar38);
          }
          auVar38 = auVar243._0_16_;
          uVar31 = vptestmd_avx512vl(local_388,local_388);
          if ((uVar31 & 0xf) != 0) {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&local_378);
              auVar38 = vxorps_avx512vl(auVar38,auVar38);
              auVar243 = ZEXT1664(auVar38);
              auVar244 = ZEXT464(0x3f800000);
              auVar240 = ZEXT3264(_DAT_01feed20);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
              auVar239 = ZEXT1664(auVar38);
              auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar238 = ZEXT3264(auVar82);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
              auVar237 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar245 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar242 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar241 = ZEXT1664(auVar38);
            }
            uVar31 = vptestmd_avx512vl(local_388,local_388);
            uVar31 = uVar31 & 0xf;
            bVar23 = (byte)uVar31;
            if (bVar23 != 0) {
              iVar20 = *(int *)(local_378.hit + 4);
              iVar21 = *(int *)(local_378.hit + 8);
              iVar22 = *(int *)(local_378.hit + 0xc);
              bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar32 = SUB81(uVar31 >> 3,0);
              *(uint *)(local_378.ray + 0xc0) =
                   (uint)(bVar23 & 1) * *(int *)local_378.hit |
                   (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0xc0);
              *(uint *)(local_378.ray + 0xc4) =
                   (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(local_378.ray + 0xc4);
              *(uint *)(local_378.ray + 200) =
                   (uint)bVar33 * iVar21 | (uint)!bVar33 * *(int *)(local_378.ray + 200);
              *(uint *)(local_378.ray + 0xcc) =
                   (uint)bVar32 * iVar22 | (uint)!bVar32 * *(int *)(local_378.ray + 0xcc);
              iVar20 = *(int *)(local_378.hit + 0x14);
              iVar21 = *(int *)(local_378.hit + 0x18);
              iVar22 = *(int *)(local_378.hit + 0x1c);
              bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar32 = SUB81(uVar31 >> 3,0);
              *(uint *)(local_378.ray + 0xd0) =
                   (uint)(bVar23 & 1) * *(int *)(local_378.hit + 0x10) |
                   (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0xd0);
              *(uint *)(local_378.ray + 0xd4) =
                   (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(local_378.ray + 0xd4);
              *(uint *)(local_378.ray + 0xd8) =
                   (uint)bVar33 * iVar21 | (uint)!bVar33 * *(int *)(local_378.ray + 0xd8);
              *(uint *)(local_378.ray + 0xdc) =
                   (uint)bVar32 * iVar22 | (uint)!bVar32 * *(int *)(local_378.ray + 0xdc);
              iVar20 = *(int *)(local_378.hit + 0x24);
              iVar21 = *(int *)(local_378.hit + 0x28);
              iVar22 = *(int *)(local_378.hit + 0x2c);
              bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar32 = SUB81(uVar31 >> 3,0);
              *(uint *)(local_378.ray + 0xe0) =
                   (uint)(bVar23 & 1) * *(int *)(local_378.hit + 0x20) |
                   (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0xe0);
              *(uint *)(local_378.ray + 0xe4) =
                   (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(local_378.ray + 0xe4);
              *(uint *)(local_378.ray + 0xe8) =
                   (uint)bVar33 * iVar21 | (uint)!bVar33 * *(int *)(local_378.ray + 0xe8);
              *(uint *)(local_378.ray + 0xec) =
                   (uint)bVar32 * iVar22 | (uint)!bVar32 * *(int *)(local_378.ray + 0xec);
              iVar20 = *(int *)(local_378.hit + 0x34);
              iVar21 = *(int *)(local_378.hit + 0x38);
              iVar22 = *(int *)(local_378.hit + 0x3c);
              bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar32 = SUB81(uVar31 >> 3,0);
              *(uint *)(local_378.ray + 0xf0) =
                   (uint)(bVar23 & 1) * *(int *)(local_378.hit + 0x30) |
                   (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0xf0);
              *(uint *)(local_378.ray + 0xf4) =
                   (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(local_378.ray + 0xf4);
              *(uint *)(local_378.ray + 0xf8) =
                   (uint)bVar33 * iVar21 | (uint)!bVar33 * *(int *)(local_378.ray + 0xf8);
              *(uint *)(local_378.ray + 0xfc) =
                   (uint)bVar32 * iVar22 | (uint)!bVar32 * *(int *)(local_378.ray + 0xfc);
              iVar20 = *(int *)(local_378.hit + 0x44);
              iVar21 = *(int *)(local_378.hit + 0x48);
              iVar22 = *(int *)(local_378.hit + 0x4c);
              bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
              bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
              bVar32 = SUB81(uVar31 >> 3,0);
              *(uint *)(local_378.ray + 0x100) =
                   (uint)(bVar23 & 1) * *(int *)(local_378.hit + 0x40) |
                   (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0x100);
              *(uint *)(local_378.ray + 0x104) =
                   (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(local_378.ray + 0x104);
              *(uint *)(local_378.ray + 0x108) =
                   (uint)bVar33 * iVar21 | (uint)!bVar33 * *(int *)(local_378.ray + 0x108);
              *(uint *)(local_378.ray + 0x10c) =
                   (uint)bVar32 * iVar22 | (uint)!bVar32 * *(int *)(local_378.ray + 0x10c);
              auVar38 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x50));
              *(undefined1 (*) [16])(local_378.ray + 0x110) = auVar38;
              auVar38 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x60));
              *(undefined1 (*) [16])(local_378.ray + 0x120) = auVar38;
              auVar38 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x70));
              *(undefined1 (*) [16])(local_378.ray + 0x130) = auVar38;
              auVar38 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x80));
              *(undefined1 (*) [16])(local_378.ray + 0x140) = auVar38;
              break;
            }
          }
          *(float *)(ray + k * 4 + 0x80) = fVar216;
          break;
        }
        lVar27 = lVar27 + -1;
      } while (lVar27 != 0);
      goto LAB_01ae0fc7;
    }
    auVar110 = vinsertps_avx(auVar132,auVar52,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }